

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  undefined4 *puVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  Layer *pLVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined4 uVar30;
  undefined4 uVar31;
  Mat *pMVar32;
  int u;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [32];
  long lVar43;
  undefined1 (*pauVar44) [16];
  long lVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  int i;
  int iVar49;
  uint uVar50;
  int iVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  int i_1;
  int iVar55;
  long lVar56;
  float *pfVar57;
  void *pvVar58;
  undefined1 (*pauVar59) [32];
  undefined1 (*pauVar60) [16];
  uint uVar61;
  void *pvVar62;
  float *pfVar63;
  int y_5;
  int iVar64;
  ulong uVar65;
  void *pvVar66;
  ulong uVar67;
  int y;
  int iVar68;
  uint uVar69;
  int iVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  void *pvVar75;
  bool bVar76;
  float fVar77;
  float fVar78;
  undefined4 uVar79;
  __m128 one;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  __m128 pos;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar233 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar235 [16];
  undefined1 auVar266 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar238 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [64];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [32];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [64];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [64];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [64];
  undefined1 auVar466 [64];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [64];
  undefined1 (*local_240) [32];
  void *local_1f0;
  undefined1 (*local_1e8) [16];
  Mat local_198;
  int local_150;
  int local_14c;
  void *local_148;
  Option *local_140;
  ulong local_138;
  Mat *local_130;
  void *local_128;
  long local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  undefined1 auVar135 [32];
  undefined1 auVar139 [32];
  undefined1 auVar142 [32];
  undefined1 auVar214 [32];
  undefined1 auVar224 [32];
  undefined1 auVar256 [32];
  undefined1 auVar267 [32];
  
  iVar64 = bottom_blob->w;
  iVar48 = bottom_blob->h;
  uVar54 = bottom_blob->elemsize;
  iVar70 = bottom_blob->elempack;
  uVar39 = (this->super_Deconvolution).num_output;
  if (opt->use_packing_layout == true) {
    uVar50 = 8;
    if ((uVar39 & 7) != 0) {
      uVar50 = (uint)((uVar39 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar50 = 1;
  }
  iVar33 = (this->super_Deconvolution).kernel_w;
  local_150 = (this->super_Deconvolution).dilation_w;
  iVar47 = (this->super_Deconvolution).stride_w;
  local_14c = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar49 = (this->super_Deconvolution).stride_h;
  iVar68 = (this->super_Deconvolution).output_pad_right;
  iVar6 = (this->super_Deconvolution).output_pad_bottom;
  uVar71 = (long)(int)uVar39 / (long)(int)uVar50 & 0xffffffff;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  auVar232._0_4_ = (this->super_Deconvolution).pad_left;
  auVar232._4_4_ = (this->super_Deconvolution).pad_right;
  auVar232._8_4_ = (this->super_Deconvolution).pad_top;
  auVar232._12_4_ = (this->super_Deconvolution).pad_bottom;
  auVar232 = vpcmpgtd_avx(auVar232,(undefined1  [16])0x0);
  lVar43 = 0x10;
  if (((((auVar232 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar232 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar232 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar232[0xf])
     && ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1))
         && (lVar43 = 8, &local_198 != top_blob)))) {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_198.data = top_blob->data;
    local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_198.elemsize = top_blob->elemsize;
    local_198.elempack = top_blob->elempack;
    local_198.allocator = top_blob->allocator;
    uVar2 = top_blob->dims;
    uVar3 = top_blob->w;
    uVar4 = top_blob->h;
    uVar5 = top_blob->d;
    local_198.c = top_blob->c;
    local_198.cstep = top_blob->cstep;
    local_198.dims = uVar2;
    local_198.w = uVar3;
    local_198.h = uVar4;
    local_198.d = uVar5;
  }
  local_150 = (iVar33 + -1) * local_150;
  iVar68 = (iVar64 + -1) * iVar47 + local_150 + iVar68 + 1;
  iVar47 = (int)((long)(int)uVar39 / (long)(int)uVar50);
  local_140 = opt;
  local_130 = top_blob;
  Mat::create(&local_198,iVar68,iVar6 + (iVar48 + -1) * iVar49 + local_14c + 1,iVar47,
              (uVar54 / (ulong)(long)iVar70) * (ulong)uVar50,uVar50,
              *(Allocator **)(&opt->lightmode + lVar43));
  iVar33 = -100;
  if ((local_198.data != (void *)0x0) && (local_198.cstep * (long)local_198.c != 0)) {
    uVar39 = (this->super_Deconvolution).kernel_w;
    uVar7 = (this->super_Deconvolution).kernel_h;
    local_148 = (void *)(long)(int)(uVar7 * uVar39);
    if (local_140->use_sgemm_convolution == true) {
      piVar8 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar70 = bottom_blob->h;
      iVar33 = bottom_blob->w;
      uVar30 = bottom_blob->dims;
      uVar31 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
        iVar33 = bottom_blob->w;
        iVar70 = bottom_blob->h;
      }
      local_d8 = 0;
      _local_a0 = CONCAT44(iVar70 * iVar33,uVar30);
      _uStack_98 = CONCAT44(uVar31,1);
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_140->lightmode;
      opt_b.use_shader_pack8 = local_140->use_shader_pack8;
      opt_b.use_subgroup_ops = local_140->use_subgroup_ops;
      opt_b.use_reserved_0 = local_140->use_reserved_0;
      opt_b.num_threads = local_140->num_threads;
      opt_b.workspace_allocator = local_140->workspace_allocator;
      opt_b.openmp_blocktime = local_140->openmp_blocktime;
      opt_b.use_winograd_convolution = local_140->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_140->use_sgemm_convolution;
      opt_b.use_int8_inference = local_140->use_int8_inference;
      opt_b.use_vulkan_compute = local_140->use_vulkan_compute;
      opt_b.use_bf16_storage = local_140->use_bf16_storage;
      opt_b.use_fp16_packed = local_140->use_fp16_packed;
      opt_b.use_fp16_storage = local_140->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_140->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_140->use_int8_packed;
      opt_b.use_int8_storage = local_140->use_int8_storage;
      opt_b.use_int8_arithmetic = local_140->use_int8_arithmetic;
      opt_b.use_packing_layout = local_140->use_packing_layout;
      opt_b.vulkan_device_index = local_140->vulkan_device_index;
      opt_b.use_reserved_1 = local_140->use_reserved_1;
      opt_b.use_image_storage = local_140->use_image_storage;
      opt_b.use_tensor_storage = local_140->use_tensor_storage;
      opt_b.use_reserved_2 = local_140->use_reserved_2;
      opt_b.flush_denormals = local_140->flush_denormals;
      opt_b.use_local_pool_allocator = local_140->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_140->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_140->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_140->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_140->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_140->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_140->use_a53_a55_optimized_kernel;
      opt_b.use_fp16_uniform = local_140->use_fp16_uniform;
      opt_b.use_int8_uniform = local_140->use_int8_uniform;
      opt_b.use_reserved_9 = local_140->use_reserved_9;
      opt_b.use_reserved_10 = local_140->use_reserved_10;
      opt_b.use_reserved_11 = local_140->use_reserved_11;
      opt_b.blob_allocator = local_198.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      iVar33 = (*this->gemm->_vptr_Layer[7])();
      if (iVar33 != 0) {
        piVar8 = (int *)CONCAT44(iStack_10c,uStack_110);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_f8 == (long *)0x0) {
              free(local_118);
            }
            else {
              (**(code **)(*local_f8 + 0x18))();
            }
          }
        }
        if (piStack_c0 != (int *)0x0) {
          LOCK();
          *piStack_c0 = *piStack_c0 + -1;
          UNLOCK();
          if (*piStack_c0 == 0) {
            if (local_a8 == (Allocator *)0x0) {
              free(local_c8);
            }
            else {
              (*local_a8->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_002752cc;
      }
      iVar70 = (iVar68 * (this->super_Deconvolution).stride_h -
               (this->super_Deconvolution).stride_w * iVar64) * uVar50;
      if (uVar50 == 1) {
        if (iVar64 < 1) {
          iVar64 = 0;
        }
        if (iVar48 < 1) {
          iVar48 = 0;
        }
        if (iVar47 < 1) {
          uVar71 = 0;
        }
        lVar43 = (long)local_198.h * (long)local_198.w;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        iVar33 = (this->super_Deconvolution).bias_data.c;
        sVar12 = (this->super_Deconvolution).bias_data.cstep;
        iVar47 = (this->super_Deconvolution).kernel_h;
        if (iVar47 < 1) {
          iVar47 = 0;
        }
        lVar53 = iStack_ec * local_108 * (long)local_148;
        local_148 = local_198.data;
        pvVar75 = local_198.data;
        for (uVar54 = 0; uVar54 != uVar71; uVar54 = uVar54 + 1) {
          iVar49 = (int)((local_198.elemsize * lVar43 + 0xf & 0xfffffffffffffff0) /
                        local_198.elemsize);
          if (local_198.dims == 4) {
            iVar49 = (int)lVar43;
          }
          uVar79 = 0;
          if ((long)iVar33 * sVar12 != 0 && pvVar11 != (void *)0x0) {
            uVar79 = *(undefined4 *)((long)pvVar11 + uVar54 * 4);
          }
          pfVar57 = (float *)(uVar54 * lVar53 + (long)local_118);
          iVar49 = iVar49 * local_198.d;
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          for (lVar45 = 0; iVar49 != (int)lVar45; lVar45 = lVar45 + 1) {
            *(undefined4 *)((long)pvVar75 + lVar45 * 4) = uVar79;
          }
          uVar39 = (this->super_Deconvolution).kernel_w;
          uVar67 = 0;
          uVar65 = (ulong)uVar39;
          if ((int)uVar39 < 1) {
            uVar65 = uVar67;
          }
          while (iVar49 = (int)uVar67, iVar49 != iVar47) {
            iVar68 = (this->super_Deconvolution).dilation_h;
            iVar6 = (this->super_Deconvolution).dilation_w;
            for (uVar67 = 0; uVar67 != uVar65; uVar67 = uVar67 + 1) {
              pfVar63 = (float *)((long)local_198.data +
                                 uVar67 * (long)iVar6 * 4 +
                                 (long)iVar49 * (long)iVar68 *
                                 (long)local_198.w * local_198.elemsize +
                                 local_198.cstep * local_198.elemsize * uVar54);
              for (iVar55 = 0; iVar55 != iVar48; iVar55 = iVar55 + 1) {
                iVar34 = (this->super_Deconvolution).stride_w;
                iVar51 = iVar64;
                while (bVar76 = iVar51 != 0, iVar51 = iVar51 + -1, bVar76) {
                  *pfVar63 = *pfVar63 + *pfVar57;
                  pfVar57 = pfVar57 + 1;
                  pfVar63 = pfVar63 + iVar34;
                }
                pfVar63 = pfVar63 + iVar70;
              }
            }
            uVar67 = (ulong)(iVar49 + 1);
          }
          pvVar75 = (void *)((long)pvVar75 + local_198.cstep * local_198.elemsize);
        }
      }
      else if (uVar50 == 4) {
        if (iVar64 < 1) {
          iVar64 = 0;
        }
        if (iVar48 < 1) {
          iVar48 = 0;
        }
        if (iVar47 < 1) {
          uVar71 = 0;
        }
        for (uVar54 = 0; uVar54 != uVar71; uVar54 = uVar54 + 1) {
          pfVar57 = (float *)((long)iStack_ec * uVar54 * (long)local_148 * local_108 +
                             (long)local_118);
          pauVar60 = (undefined1 (*) [16])
                     (local_198.cstep * uVar54 * local_198.elemsize + (long)local_198.data);
          uVar67 = (long)local_198.h * (long)local_198.w;
          uVar65 = (local_198.elemsize * uVar67 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar65 = uVar67;
          }
          pvVar11 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar11 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar33 = local_198.d * (int)uVar65;
            pauVar44 = pauVar60;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            while (iVar33 != 0) {
              *(undefined8 *)*pauVar44 = 0;
              *(undefined8 *)(*pauVar44 + 8) = 0;
              pauVar44 = pauVar44 + 1;
              iVar33 = iVar33 + -1;
            }
          }
          else {
            auVar232 = *(undefined1 (*) [16])((long)pvVar11 + uVar54 * 0x10);
            iVar33 = local_198.d * (int)uVar65;
            pauVar44 = pauVar60;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            while (iVar33 != 0) {
              *pauVar44 = auVar232;
              pauVar44 = pauVar44 + 1;
              iVar33 = iVar33 + -1;
            }
          }
          for (iVar33 = 0; iVar33 < (this->super_Deconvolution).kernel_h; iVar33 = iVar33 + 1) {
            for (iVar47 = 0; iVar47 < (this->super_Deconvolution).kernel_w; iVar47 = iVar47 + 1) {
              pauVar44 = (undefined1 (*) [16])
                         (*pauVar60 +
                         (long)((this->super_Deconvolution).dilation_w * iVar47 * 4) * 4 +
                         (long)iVar33 * (long)(this->super_Deconvolution).dilation_h *
                         local_198.elemsize * (long)local_198.w);
              for (iVar49 = 0; iVar68 = iVar64, iVar49 != iVar48; iVar49 = iVar49 + 1) {
                while (iVar68 != 0) {
                  auVar133._0_4_ = *pfVar57 + *(float *)*pauVar44;
                  auVar133._4_4_ = pfVar57[1] + *(float *)(*pauVar44 + 4);
                  auVar133._8_4_ = pfVar57[2] + *(float *)(*pauVar44 + 8);
                  auVar133._12_4_ = pfVar57[3] + *(float *)(*pauVar44 + 0xc);
                  *pauVar44 = auVar133;
                  pauVar44 = pauVar44 + (this->super_Deconvolution).stride_w;
                  pfVar57 = pfVar57 + 4;
                  iVar68 = iVar68 + -1;
                }
                pauVar44 = (undefined1 (*) [16])(*pauVar44 + (long)iVar70 * 4);
              }
            }
          }
        }
      }
      else if (uVar50 == 8) {
        if (iVar64 < 1) {
          iVar64 = 0;
        }
        if (iVar48 < 1) {
          iVar48 = 0;
        }
        if (iVar47 < 1) {
          uVar71 = 0;
        }
        for (uVar54 = 0; uVar54 != uVar71; uVar54 = uVar54 + 1) {
          pfVar57 = (float *)((long)iStack_ec * uVar54 * (long)local_148 * local_108 +
                             (long)local_118);
          pauVar59 = (undefined1 (*) [32])
                     (local_198.cstep * uVar54 * local_198.elemsize + (long)local_198.data);
          uVar67 = (long)local_198.h * (long)local_198.w;
          uVar65 = (local_198.elemsize * uVar67 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar65 = uVar67;
          }
          pvVar11 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar11 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar33 = local_198.d * (int)uVar65;
            pauVar42 = pauVar59;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            while (iVar33 != 0) {
              *(undefined8 *)*pauVar42 = 0;
              *(undefined8 *)(*pauVar42 + 8) = 0;
              *(undefined8 *)(*pauVar42 + 0x10) = 0;
              *(undefined8 *)(*pauVar42 + 0x18) = 0;
              pauVar42 = pauVar42 + 1;
              iVar33 = iVar33 + -1;
            }
          }
          else {
            auVar463 = *(undefined1 (*) [32])((long)pvVar11 + uVar54 * 0x20);
            iVar33 = local_198.d * (int)uVar65;
            pauVar42 = pauVar59;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            while (iVar33 != 0) {
              *pauVar42 = auVar463;
              pauVar42 = pauVar42 + 1;
              iVar33 = iVar33 + -1;
            }
          }
          for (iVar33 = 0; iVar33 < (this->super_Deconvolution).kernel_h; iVar33 = iVar33 + 1) {
            for (iVar47 = 0; iVar47 < (this->super_Deconvolution).kernel_w; iVar47 = iVar47 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         (*pauVar59 +
                         (long)((this->super_Deconvolution).dilation_w * iVar47 * 8) * 4 +
                         (long)iVar33 * (long)(this->super_Deconvolution).dilation_h *
                         local_198.elemsize * (long)local_198.w);
              for (iVar49 = 0; iVar68 = iVar64, iVar49 != iVar48; iVar49 = iVar49 + 1) {
                while (iVar68 != 0) {
                  auVar144._0_4_ = *pfVar57 + *(float *)*pauVar42;
                  auVar144._4_4_ = pfVar57[1] + *(float *)(*pauVar42 + 4);
                  auVar144._8_4_ = pfVar57[2] + *(float *)(*pauVar42 + 8);
                  auVar144._12_4_ = pfVar57[3] + *(float *)(*pauVar42 + 0xc);
                  auVar144._16_4_ = pfVar57[4] + *(float *)(*pauVar42 + 0x10);
                  auVar144._20_4_ = pfVar57[5] + *(float *)(*pauVar42 + 0x14);
                  auVar144._24_4_ = pfVar57[6] + *(float *)(*pauVar42 + 0x18);
                  auVar144._28_4_ = pfVar57[7] + *(float *)(*pauVar42 + 0x1c);
                  *pauVar42 = auVar144;
                  pauVar42 = pauVar42 + (this->super_Deconvolution).stride_w;
                  pfVar57 = pfVar57 + 8;
                  iVar68 = iVar68 + -1;
                }
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + (long)iVar70 * 4);
              }
            }
          }
        }
      }
      pLVar13 = this->activation;
      if (pLVar13 != (Layer *)0x0) {
        (*pLVar13->_vptr_Layer[9])(pLVar13,&local_198,local_140);
      }
      piVar8 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if ((iVar70 == 8) && (uVar50 == 8)) {
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar71 = 0;
        if (0 < (int)uVar7) {
          uVar71 = (ulong)uVar7;
        }
        uVar65 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar65 = 0;
        }
        auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar312 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar369 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar463._8_4_ = 0x3e2aaaaa;
        auVar463._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar463._12_4_ = 0x3e2aaaaa;
        auVar463._16_4_ = 0x3e2aaaaa;
        auVar463._20_4_ = 0x3e2aaaaa;
        auVar463._24_4_ = 0x3e2aaaaa;
        auVar463._28_4_ = 0x3e2aaaaa;
        auVar400._8_4_ = 0x3f800000;
        auVar400._0_8_ = 0x3f8000003f800000;
        auVar400._12_4_ = 0x3f800000;
        for (uVar67 = 0; uVar67 != uVar65; uVar67 = uVar67 + 1) {
          local_240 = (undefined1 (*) [32])
                      (local_198.cstep * uVar67 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar46 = 0;
          uVar36 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar36 = uVar46;
          }
          uVar69 = local_198.w;
          if (local_198.w < 1) {
            uVar69 = uVar46;
          }
          uVar37 = local_198.h;
          if (local_198.h < 1) {
            uVar37 = uVar46;
          }
          for (; uVar46 != uVar37; uVar46 = uVar46 + 1) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar35 = 0; uVar35 != uVar69; uVar35 = uVar35 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar145 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar145 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar11 + uVar67 * 0x20));
              }
              pvVar75 = bottom_blob->data;
              lVar43 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar67 * (this->weight_data_tm).elemsize +
                       0xe0;
              for (uVar41 = 0; uVar41 != uVar36; uVar41 = uVar41 + 1) {
                lVar53 = lVar43;
                for (uVar72 = 0; uVar72 != uVar71; uVar72 = uVar72 + 1) {
                  iVar34 = (((int)uVar72 - uVar7) + 1) * iVar48 + uVar46;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    lVar45 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar41;
                    iVar34 = iVar55;
                    for (lVar56 = 0; uVar54 * 0x100 != lVar56; lVar56 = lVar56 + 0x100) {
                      if (((-1 < iVar34) && (iVar51 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar51 < iVar68)) {
                        lVar40 = (long)(iVar51 << 3);
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45);
                        auVar138._4_4_ = uVar79;
                        auVar138._0_4_ = uVar79;
                        auVar138._8_4_ = uVar79;
                        auVar138._12_4_ = uVar79;
                        auVar138._16_4_ = uVar79;
                        auVar138._20_4_ = uVar79;
                        auVar138._24_4_ = uVar79;
                        auVar138._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 4);
                        auVar89._4_4_ = uVar79;
                        auVar89._0_4_ = uVar79;
                        auVar89._8_4_ = uVar79;
                        auVar89._12_4_ = uVar79;
                        auVar89._16_4_ = uVar79;
                        auVar89._20_4_ = uVar79;
                        auVar89._24_4_ = uVar79;
                        auVar89._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 8);
                        auVar87._4_4_ = uVar79;
                        auVar87._0_4_ = uVar79;
                        auVar87._8_4_ = uVar79;
                        auVar87._12_4_ = uVar79;
                        auVar87._16_4_ = uVar79;
                        auVar87._20_4_ = uVar79;
                        auVar87._24_4_ = uVar79;
                        auVar87._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0xc);
                        auVar415._4_4_ = uVar79;
                        auVar415._0_4_ = uVar79;
                        auVar415._8_4_ = uVar79;
                        auVar415._12_4_ = uVar79;
                        auVar415._16_4_ = uVar79;
                        auVar415._20_4_ = uVar79;
                        auVar415._24_4_ = uVar79;
                        auVar415._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x10);
                        auVar433._4_4_ = uVar79;
                        auVar433._0_4_ = uVar79;
                        auVar433._8_4_ = uVar79;
                        auVar433._12_4_ = uVar79;
                        auVar433._16_4_ = uVar79;
                        auVar433._20_4_ = uVar79;
                        auVar433._24_4_ = uVar79;
                        auVar433._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x14);
                        auVar473._4_4_ = uVar79;
                        auVar473._0_4_ = uVar79;
                        auVar473._8_4_ = uVar79;
                        auVar473._12_4_ = uVar79;
                        auVar473._16_4_ = uVar79;
                        auVar473._20_4_ = uVar79;
                        auVar473._24_4_ = uVar79;
                        auVar473._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x18);
                        auVar451._4_4_ = uVar79;
                        auVar451._0_4_ = uVar79;
                        auVar451._8_4_ = uVar79;
                        auVar451._12_4_ = uVar79;
                        auVar451._16_4_ = uVar79;
                        auVar451._20_4_ = uVar79;
                        auVar451._24_4_ = uVar79;
                        auVar451._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x1c);
                        auVar457._4_4_ = uVar79;
                        auVar457._0_4_ = uVar79;
                        auVar457._8_4_ = uVar79;
                        auVar457._12_4_ = uVar79;
                        auVar457._16_4_ = uVar79;
                        auVar457._20_4_ = uVar79;
                        auVar457._24_4_ = uVar79;
                        auVar457._28_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar145._0_32_,auVar138,
                                                   *(undefined1 (*) [32])(lVar53 + -0xe0 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar89,
                                                   *(undefined1 (*) [32])(lVar53 + -0xc0 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar87,
                                                   *(undefined1 (*) [32])(lVar53 + -0xa0 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar415,
                                                   *(undefined1 (*) [32])(lVar53 + -0x80 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar433,
                                                   *(undefined1 (*) [32])(lVar53 + -0x60 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar473,
                                                   *(undefined1 (*) [32])(lVar53 + -0x40 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar451,
                                                   *(undefined1 (*) [32])(lVar53 + -0x20 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar457,
                                                   *(undefined1 (*) [32])(lVar53 + lVar56));
                        auVar145 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  lVar53 = lVar53 + (long)(int)uVar39 * 0x100;
                }
                lVar43 = lVar43 + (long)(int)(uVar39 * uVar7 * 0x40) * 4;
              }
              auVar89 = auVar145._0_32_;
              auVar138 = auVar89;
              if (5 < iVar49 - 1U) goto switchD_002712f4_caseD_1;
              auVar87 = auVar95._0_32_;
              auVar138 = vmaxps_avx(auVar89,auVar87);
              auVar433 = auVar369._0_32_;
              auVar415 = auVar312._0_32_;
              fVar78 = auVar369._0_4_;
              fVar77 = auVar369._4_4_;
              fVar1 = auVar369._8_4_;
              fVar231 = auVar369._12_4_;
              fVar14 = auVar369._16_4_;
              fVar15 = auVar369._20_4_;
              fVar16 = auVar369._24_4_;
              fVar17 = auVar369._28_4_;
              switch(iVar49) {
              case 2:
                auVar89 = vminps_avx(auVar89,auVar87);
                uVar79 = *(this->super_Deconvolution).activation_params.data;
                auVar474._4_4_ = uVar79;
                auVar474._0_4_ = uVar79;
                auVar474._8_4_ = uVar79;
                auVar474._12_4_ = uVar79;
                auVar474._16_4_ = uVar79;
                auVar474._20_4_ = uVar79;
                auVar474._24_4_ = uVar79;
                auVar474._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar138,auVar89,auVar474);
                auVar138 = ZEXT1632(auVar232);
                break;
              case 3:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar203._4_4_ = uVar79;
                auVar203._0_4_ = uVar79;
                auVar203._8_4_ = uVar79;
                auVar203._12_4_ = uVar79;
                auVar203._16_4_ = uVar79;
                auVar203._20_4_ = uVar79;
                auVar203._24_4_ = uVar79;
                auVar203._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar476._4_4_ = uVar79;
                auVar476._0_4_ = uVar79;
                auVar476._8_4_ = uVar79;
                auVar476._12_4_ = uVar79;
                auVar476._16_4_ = uVar79;
                auVar476._20_4_ = uVar79;
                auVar476._24_4_ = uVar79;
                auVar476._28_4_ = uVar79;
                auVar138 = vmaxps_avx(auVar89,auVar203);
                auVar138 = vminps_avx(auVar476,auVar138);
                break;
              case 4:
                auVar134._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar134._8_4_ = -auVar145._8_4_;
                auVar134._12_4_ = -auVar145._12_4_;
                auVar134._16_4_ = -auVar145._16_4_;
                auVar134._20_4_ = -auVar145._20_4_;
                auVar134._24_4_ = -auVar145._24_4_;
                auVar134._28_4_ = auVar145._28_4_ ^ 0x80000000;
                auVar204._8_4_ = 0x42b0c0a5;
                auVar204._0_8_ = 0x42b0c0a542b0c0a5;
                auVar204._12_4_ = 0x42b0c0a5;
                auVar204._16_4_ = 0x42b0c0a5;
                auVar204._20_4_ = 0x42b0c0a5;
                auVar204._24_4_ = 0x42b0c0a5;
                auVar204._28_4_ = 0x42b0c0a5;
                auVar138 = vminps_avx(auVar134,auVar204);
                auVar205._8_4_ = 0xc2b0c0a5;
                auVar205._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar205._12_4_ = 0xc2b0c0a5;
                auVar205._16_4_ = 0xc2b0c0a5;
                auVar205._20_4_ = 0xc2b0c0a5;
                auVar205._24_4_ = 0xc2b0c0a5;
                auVar205._28_4_ = 0xc2b0c0a5;
                auVar89 = vmaxps_avx(auVar138,auVar205);
                auVar206._8_4_ = 0x3fb8aa3b;
                auVar206._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar206._12_4_ = 0x3fb8aa3b;
                auVar206._16_4_ = 0x3fb8aa3b;
                auVar206._20_4_ = 0x3fb8aa3b;
                auVar206._24_4_ = 0x3fb8aa3b;
                auVar206._28_4_ = 0x3fb8aa3b;
                auVar232 = vfmadd213ps_fma(auVar206,auVar89,auVar415);
                auVar87 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar138 = vcmpps_avx(ZEXT1632(auVar232),auVar87,1);
                auVar138 = vandps_avx(auVar138,auVar433);
                auVar138 = vsubps_avx(auVar87,auVar138);
                auVar247._8_4_ = 0x3f318000;
                auVar247._0_8_ = 0x3f3180003f318000;
                auVar247._12_4_ = 0x3f318000;
                auVar247._16_4_ = 0x3f318000;
                auVar247._20_4_ = 0x3f318000;
                auVar247._24_4_ = 0x3f318000;
                auVar247._28_4_ = 0x3f318000;
                auVar232 = vfmsub231ps_fma(auVar89,auVar138,auVar247);
                auVar248._8_4_ = 0x395e8083;
                auVar248._0_8_ = 0x395e8083395e8083;
                auVar248._12_4_ = 0x395e8083;
                auVar248._16_4_ = 0x395e8083;
                auVar248._20_4_ = 0x395e8083;
                auVar248._24_4_ = 0x395e8083;
                auVar248._28_4_ = 0x395e8083;
                auVar399 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar138,auVar248);
                auVar89 = ZEXT1632(auVar399);
                auVar21._28_4_ = auVar87._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(auVar399._12_4_ * auVar399._12_4_,
                                        CONCAT48(auVar399._8_4_ * auVar399._8_4_,
                                                 CONCAT44(auVar399._4_4_ * auVar399._4_4_,
                                                          auVar399._0_4_ * auVar399._0_4_))));
                auVar419._8_4_ = 0x39506967;
                auVar419._0_8_ = 0x3950696739506967;
                auVar419._12_4_ = 0x39506967;
                auVar419._16_4_ = 0x39506967;
                auVar419._20_4_ = 0x39506967;
                auVar419._24_4_ = 0x39506967;
                auVar419._28_4_ = 0x39506967;
                auVar249._8_4_ = 0x3ab743ce;
                auVar249._0_8_ = 0x3ab743ce3ab743ce;
                auVar249._12_4_ = 0x3ab743ce;
                auVar249._16_4_ = 0x3ab743ce;
                auVar249._20_4_ = 0x3ab743ce;
                auVar249._24_4_ = 0x3ab743ce;
                auVar249._28_4_ = 0x3ab743ce;
                auVar232 = vfmadd213ps_fma(auVar419,auVar89,auVar249);
                auVar250._8_4_ = 0x3c088908;
                auVar250._0_8_ = 0x3c0889083c088908;
                auVar250._12_4_ = 0x3c088908;
                auVar250._16_4_ = 0x3c088908;
                auVar250._20_4_ = 0x3c088908;
                auVar250._24_4_ = 0x3c088908;
                auVar250._28_4_ = 0x3c088908;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar250);
                auVar251._8_4_ = 0x3d2aa9c1;
                auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar251._12_4_ = 0x3d2aa9c1;
                auVar251._16_4_ = 0x3d2aa9c1;
                auVar251._20_4_ = 0x3d2aa9c1;
                auVar251._24_4_ = 0x3d2aa9c1;
                auVar251._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar251);
                auVar252._8_4_ = 0x3e2aaaaa;
                auVar252._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar252._12_4_ = 0x3e2aaaaa;
                auVar252._16_4_ = 0x3e2aaaaa;
                auVar252._20_4_ = 0x3e2aaaaa;
                auVar252._24_4_ = 0x3e2aaaaa;
                auVar252._28_4_ = 0x3e2aaaaa;
                auVar89 = ZEXT1632(auVar399);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar252);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar415);
                auVar377 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar21,auVar89);
                auVar96._0_4_ = (int)auVar138._0_4_;
                auVar96._4_4_ = (int)auVar138._4_4_;
                auVar96._8_4_ = (int)auVar138._8_4_;
                auVar96._12_4_ = (int)auVar138._12_4_;
                auVar135._16_4_ = (int)auVar138._16_4_;
                auVar135._0_16_ = auVar96;
                auVar135._20_4_ = (int)auVar138._20_4_;
                auVar135._24_4_ = (int)auVar138._24_4_;
                auVar135._28_4_ = (int)auVar138._28_4_;
                auVar399 = vpslld_avx(auVar96,0x17);
                auVar232 = vpslld_avx(auVar135._16_16_,0x17);
                auVar233._8_4_ = 0x3f800000;
                auVar233._0_8_ = 0x3f8000003f800000;
                auVar233._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar233);
                auVar399 = vpaddd_avx(auVar399,auVar233);
                auVar136._16_16_ = auVar232;
                auVar136._0_16_ = auVar399;
                auVar207._0_4_ = auVar377._0_4_ + fVar78;
                auVar207._4_4_ = auVar377._4_4_ + fVar77;
                auVar207._8_4_ = auVar377._8_4_ + fVar1;
                auVar207._12_4_ = auVar377._12_4_ + fVar231;
                auVar207._16_4_ = fVar14 + 0.0;
                auVar207._20_4_ = fVar15 + 0.0;
                auVar207._24_4_ = fVar16 + 0.0;
                auVar207._28_4_ = fVar17 + 0.0;
                auVar232 = vfmadd213ps_fma(auVar136,auVar207,auVar433);
                auVar138 = vdivps_avx(auVar433,ZEXT1632(auVar232));
                break;
              case 5:
                auVar452._8_4_ = 0x42b0c0a5;
                auVar452._0_8_ = 0x42b0c0a542b0c0a5;
                auVar452._12_4_ = 0x42b0c0a5;
                auVar452._16_4_ = 0x42b0c0a5;
                auVar452._20_4_ = 0x42b0c0a5;
                auVar452._24_4_ = 0x42b0c0a5;
                auVar452._28_4_ = 0x42b0c0a5;
                auVar138 = vminps_avx(auVar452,auVar89);
                auVar458._8_4_ = 0xc2b0c0a5;
                auVar458._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar458._12_4_ = 0xc2b0c0a5;
                auVar458._16_4_ = 0xc2b0c0a5;
                auVar458._20_4_ = 0xc2b0c0a5;
                auVar458._24_4_ = 0xc2b0c0a5;
                auVar458._28_4_ = 0xc2b0c0a5;
                auVar89 = vmaxps_avx(auVar458,auVar138);
                auVar416._8_4_ = 0x3fb8aa3b;
                auVar416._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar416._12_4_ = 0x3fb8aa3b;
                auVar416._16_4_ = 0x3fb8aa3b;
                auVar416._20_4_ = 0x3fb8aa3b;
                auVar416._24_4_ = 0x3fb8aa3b;
                auVar416._28_4_ = 0x3fb8aa3b;
                auVar232 = vfmadd213ps_fma(auVar416,auVar89,auVar415);
                auVar87 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar138 = vcmpps_avx(ZEXT1632(auVar232),auVar87,1);
                auVar138 = vandps_avx(auVar138,auVar433);
                auVar138 = vsubps_avx(auVar87,auVar138);
                auVar459._8_4_ = 0x3f318000;
                auVar459._0_8_ = 0x3f3180003f318000;
                auVar459._12_4_ = 0x3f318000;
                auVar459._16_4_ = 0x3f318000;
                auVar459._20_4_ = 0x3f318000;
                auVar459._24_4_ = 0x3f318000;
                auVar459._28_4_ = 0x3f318000;
                auVar232 = vfmsub231ps_fma(auVar89,auVar138,auVar459);
                auVar453._8_4_ = 0xb95e8083;
                auVar453._0_8_ = 0xb95e8083b95e8083;
                auVar453._12_4_ = 0xb95e8083;
                auVar453._16_4_ = 0xb95e8083;
                auVar453._20_4_ = 0xb95e8083;
                auVar453._24_4_ = 0xb95e8083;
                auVar453._28_4_ = 0xb95e8083;
                auVar399 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar138,auVar453);
                auVar89 = ZEXT1632(auVar399);
                auVar18._28_4_ = auVar87._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(auVar399._12_4_ * auVar399._12_4_,
                                        CONCAT48(auVar399._8_4_ * auVar399._8_4_,
                                                 CONCAT44(auVar399._4_4_ * auVar399._4_4_,
                                                          auVar399._0_4_ * auVar399._0_4_))));
                auVar372._8_4_ = 0x39506967;
                auVar372._0_8_ = 0x3950696739506967;
                auVar372._12_4_ = 0x39506967;
                auVar372._16_4_ = 0x39506967;
                auVar372._20_4_ = 0x39506967;
                auVar372._24_4_ = 0x39506967;
                auVar372._28_4_ = 0x39506967;
                auVar397._8_4_ = 0x3ab743ce;
                auVar397._0_8_ = 0x3ab743ce3ab743ce;
                auVar397._12_4_ = 0x3ab743ce;
                auVar397._16_4_ = 0x3ab743ce;
                auVar397._20_4_ = 0x3ab743ce;
                auVar397._24_4_ = 0x3ab743ce;
                auVar397._28_4_ = 0x3ab743ce;
                auVar232 = vfmadd213ps_fma(auVar372,auVar89,auVar397);
                auVar309._8_4_ = 0x3c088908;
                auVar309._0_8_ = 0x3c0889083c088908;
                auVar309._12_4_ = 0x3c088908;
                auVar309._16_4_ = 0x3c088908;
                auVar309._20_4_ = 0x3c088908;
                auVar309._24_4_ = 0x3c088908;
                auVar309._28_4_ = 0x3c088908;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar309);
                auVar346._8_4_ = 0x3d2aa9c1;
                auVar346._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar346._12_4_ = 0x3d2aa9c1;
                auVar346._16_4_ = 0x3d2aa9c1;
                auVar346._20_4_ = 0x3d2aa9c1;
                auVar346._24_4_ = 0x3d2aa9c1;
                auVar346._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar346);
                auVar89 = ZEXT1632(auVar399);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar463);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar415);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar18,auVar89);
                auVar197._0_4_ = auVar232._0_4_ + fVar78;
                auVar197._4_4_ = auVar232._4_4_ + fVar77;
                auVar197._8_4_ = auVar232._8_4_ + fVar1;
                auVar197._12_4_ = auVar232._12_4_ + fVar231;
                auVar197._16_4_ = fVar14 + 0.0;
                auVar197._20_4_ = fVar15 + 0.0;
                auVar197._24_4_ = fVar16 + 0.0;
                auVar197._28_4_ = fVar17 + 0.0;
                auVar377._0_4_ = (int)auVar138._0_4_;
                auVar377._4_4_ = (int)auVar138._4_4_;
                auVar377._8_4_ = (int)auVar138._8_4_;
                auVar377._12_4_ = (int)auVar138._12_4_;
                auVar240._16_4_ = (int)auVar138._16_4_;
                auVar240._0_16_ = auVar377;
                auVar240._20_4_ = (int)auVar138._20_4_;
                auVar240._24_4_ = (int)auVar138._24_4_;
                auVar240._28_4_ = (int)auVar138._28_4_;
                auVar399 = vpslld_avx(auVar377,0x17);
                auVar232 = vpslld_avx(auVar240._16_16_,0x17);
                auVar232 = vpaddd_avx(auVar400,auVar232);
                auVar399 = vpaddd_avx(auVar399,auVar400);
                auVar475._16_16_ = auVar232;
                auVar475._0_16_ = auVar399;
                auVar377 = vfmadd213ps_fma(auVar475,auVar197,auVar433);
                auVar198._8_4_ = 0x800000;
                auVar198._0_8_ = 0x80000000800000;
                auVar198._12_4_ = 0x800000;
                auVar198._16_4_ = 0x800000;
                auVar198._20_4_ = 0x800000;
                auVar198._24_4_ = 0x800000;
                auVar198._28_4_ = 0x800000;
                auVar138 = vmaxps_avx(ZEXT1632(auVar377),auVar198);
                auVar399 = vpsrld_avx(auVar138._0_16_,0x17);
                auVar232 = vpsrld_avx(auVar138._16_16_,0x17);
                auVar323._8_4_ = 0x807fffff;
                auVar323._0_8_ = 0x807fffff807fffff;
                auVar323._12_4_ = 0x807fffff;
                auVar323._16_4_ = 0x807fffff;
                auVar323._20_4_ = 0x807fffff;
                auVar323._24_4_ = 0x807fffff;
                auVar323._28_4_ = 0x807fffff;
                auVar138 = vandps_avx(auVar138,auVar323);
                auVar87 = vorps_avx(auVar138,auVar415);
                auVar324._8_4_ = 0x3f3504f3;
                auVar324._0_8_ = 0x3f3504f33f3504f3;
                auVar324._12_4_ = 0x3f3504f3;
                auVar324._16_4_ = 0x3f3504f3;
                auVar324._20_4_ = 0x3f3504f3;
                auVar324._24_4_ = 0x3f3504f3;
                auVar324._28_4_ = 0x3f3504f3;
                auVar89 = vcmpps_avx(auVar324,auVar87,2);
                auVar138 = vandnps_avx(auVar89,auVar87);
                auVar398._8_4_ = 0xbf800000;
                auVar398._0_8_ = 0xbf800000bf800000;
                auVar398._12_4_ = 0xbf800000;
                auVar398._16_4_ = 0xbf800000;
                auVar398._20_4_ = 0xbf800000;
                auVar398._24_4_ = 0xbf800000;
                auVar398._28_4_ = 0xbf800000;
                auVar199._0_4_ = auVar138._0_4_ + auVar87._0_4_ + -1.0;
                auVar199._4_4_ = auVar138._4_4_ + auVar87._4_4_ + -1.0;
                auVar199._8_4_ = auVar138._8_4_ + auVar87._8_4_ + -1.0;
                auVar199._12_4_ = auVar138._12_4_ + auVar87._12_4_ + -1.0;
                auVar199._16_4_ = auVar138._16_4_ + auVar87._16_4_ + -1.0;
                auVar199._20_4_ = auVar138._20_4_ + auVar87._20_4_ + -1.0;
                auVar199._24_4_ = auVar138._24_4_ + auVar87._24_4_ + -1.0;
                auVar199._28_4_ = auVar138._28_4_ + auVar87._28_4_ + -1.0;
                auVar232 = vpsubd_avx(auVar232,auVar89._16_16_);
                auVar383._8_4_ = 0xffffff81;
                auVar383._0_8_ = 0xffffff81ffffff81;
                auVar383._12_4_ = 0xffffff81;
                auVar232 = vpaddd_avx(auVar232,auVar383);
                auVar399 = vpsubd_avx(auVar399,auVar89._0_16_);
                auVar399 = vpaddd_avx(auVar383,auVar399);
                auVar241._16_16_ = auVar232;
                auVar241._0_16_ = auVar399;
                auVar19._4_4_ = auVar199._4_4_ * auVar199._4_4_;
                auVar19._0_4_ = auVar199._0_4_ * auVar199._0_4_;
                auVar19._8_4_ = auVar199._8_4_ * auVar199._8_4_;
                auVar19._12_4_ = auVar199._12_4_ * auVar199._12_4_;
                auVar19._16_4_ = auVar199._16_4_ * auVar199._16_4_;
                auVar19._20_4_ = auVar199._20_4_ * auVar199._20_4_;
                auVar19._24_4_ = auVar199._24_4_ * auVar199._24_4_;
                auVar19._28_4_ = auVar89._28_4_;
                auVar417._8_4_ = 0x3d9021bb;
                auVar417._0_8_ = 0x3d9021bb3d9021bb;
                auVar417._12_4_ = 0x3d9021bb;
                auVar417._16_4_ = 0x3d9021bb;
                auVar417._20_4_ = 0x3d9021bb;
                auVar417._24_4_ = 0x3d9021bb;
                auVar417._28_4_ = 0x3d9021bb;
                auVar434._8_4_ = 0xbdebd1b8;
                auVar434._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar434._12_4_ = 0xbdebd1b8;
                auVar434._16_4_ = 0xbdebd1b8;
                auVar434._20_4_ = 0xbdebd1b8;
                auVar434._24_4_ = 0xbdebd1b8;
                auVar434._28_4_ = 0xbdebd1b8;
                auVar232 = vfmadd213ps_fma(auVar417,auVar199,auVar434);
                auVar435._8_4_ = 0x3def251a;
                auVar435._0_8_ = 0x3def251a3def251a;
                auVar435._12_4_ = 0x3def251a;
                auVar435._16_4_ = 0x3def251a;
                auVar435._20_4_ = 0x3def251a;
                auVar435._24_4_ = 0x3def251a;
                auVar435._28_4_ = 0x3def251a;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar435);
                auVar436._8_4_ = 0xbdfe5d4f;
                auVar436._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar436._12_4_ = 0xbdfe5d4f;
                auVar436._16_4_ = 0xbdfe5d4f;
                auVar436._20_4_ = 0xbdfe5d4f;
                auVar436._24_4_ = 0xbdfe5d4f;
                auVar436._28_4_ = 0xbdfe5d4f;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar436);
                auVar437._8_4_ = 0x3e11e9bf;
                auVar437._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar437._12_4_ = 0x3e11e9bf;
                auVar437._16_4_ = 0x3e11e9bf;
                auVar437._20_4_ = 0x3e11e9bf;
                auVar437._24_4_ = 0x3e11e9bf;
                auVar437._28_4_ = 0x3e11e9bf;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar437);
                auVar438._8_4_ = 0xbe2aae50;
                auVar438._0_8_ = 0xbe2aae50be2aae50;
                auVar438._12_4_ = 0xbe2aae50;
                auVar438._16_4_ = 0xbe2aae50;
                auVar438._20_4_ = 0xbe2aae50;
                auVar438._24_4_ = 0xbe2aae50;
                auVar438._28_4_ = 0xbe2aae50;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar438);
                auVar439._8_4_ = 0x3e4cceac;
                auVar439._0_8_ = 0x3e4cceac3e4cceac;
                auVar439._12_4_ = 0x3e4cceac;
                auVar439._16_4_ = 0x3e4cceac;
                auVar439._20_4_ = 0x3e4cceac;
                auVar439._24_4_ = 0x3e4cceac;
                auVar439._28_4_ = 0x3e4cceac;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar439);
                auVar440._8_4_ = 0xbe7ffffc;
                auVar440._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar440._12_4_ = 0xbe7ffffc;
                auVar440._16_4_ = 0xbe7ffffc;
                auVar440._20_4_ = 0xbe7ffffc;
                auVar440._24_4_ = 0xbe7ffffc;
                auVar440._28_4_ = 0xbe7ffffc;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar440);
                auVar441._8_4_ = 0x3eaaaaaa;
                auVar441._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar441._12_4_ = 0x3eaaaaaa;
                auVar441._16_4_ = 0x3eaaaaaa;
                auVar441._20_4_ = 0x3eaaaaaa;
                auVar441._24_4_ = 0x3eaaaaaa;
                auVar441._28_4_ = 0x3eaaaaaa;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar199,auVar441);
                auVar418._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar199._0_4_ * auVar232._0_4_;
                auVar418._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar199._4_4_ * auVar232._4_4_;
                auVar418._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar199._8_4_ * auVar232._8_4_;
                auVar418._12_4_ =
                     auVar199._12_4_ * auVar199._12_4_ * auVar199._12_4_ * auVar232._12_4_;
                auVar418._16_4_ = auVar199._16_4_ * auVar199._16_4_ * auVar199._16_4_ * 0.0;
                auVar418._20_4_ = auVar199._20_4_ * auVar199._20_4_ * auVar199._20_4_ * 0.0;
                auVar418._24_4_ = auVar199._24_4_ * auVar199._24_4_ * auVar199._24_4_ * 0.0;
                auVar418._28_4_ = 0;
                auVar89 = vcvtdq2ps_avx(auVar241);
                auVar232 = vfmadd231ps_fma(auVar418,auVar89,auVar453);
                auVar232 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar415,auVar19);
                auVar138 = vcmpps_avx(ZEXT1632(auVar377),_DAT_00539a00,2);
                auVar87 = vsubps_avx(ZEXT1632(auVar232),auVar199);
                auVar232 = vfmsub231ps_fma(auVar87,auVar459,auVar89);
                auVar442._8_4_ = 0xc0000000;
                auVar442._0_8_ = 0xc0000000c0000000;
                auVar442._12_4_ = 0xc0000000;
                auVar442._16_4_ = 0xc0000000;
                auVar442._20_4_ = 0xc0000000;
                auVar442._24_4_ = 0xc0000000;
                auVar442._28_4_ = 0xc0000000;
                auVar200._0_4_ = auVar232._0_4_ * -2.0;
                auVar200._4_4_ = auVar232._4_4_ * -2.0;
                auVar200._8_4_ = auVar232._8_4_ * -2.0;
                auVar200._12_4_ = auVar232._12_4_ * -2.0;
                auVar200._16_4_ = 0x80000000;
                auVar200._20_4_ = 0x80000000;
                auVar200._24_4_ = 0x80000000;
                auVar200._28_4_ = 0;
                auVar242._8_4_ = 0x7fffffff;
                auVar242._0_8_ = 0x7fffffff7fffffff;
                auVar242._12_4_ = 0x7fffffff;
                auVar242._16_4_ = 0x7fffffff;
                auVar242._20_4_ = 0x7fffffff;
                auVar242._24_4_ = 0x7fffffff;
                auVar242._28_4_ = 0x7fffffff;
                auVar138 = vblendvps_avx(auVar200,auVar242,auVar138);
                auVar243._8_4_ = 0x42b0c0a5;
                auVar243._0_8_ = 0x42b0c0a542b0c0a5;
                auVar243._12_4_ = 0x42b0c0a5;
                auVar243._16_4_ = 0x42b0c0a5;
                auVar243._20_4_ = 0x42b0c0a5;
                auVar243._24_4_ = 0x42b0c0a5;
                auVar243._28_4_ = 0x42b0c0a5;
                auVar138 = vminps_avx(auVar138,auVar243);
                auVar244._8_4_ = 0xc2b0c0a5;
                auVar244._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar244._12_4_ = 0xc2b0c0a5;
                auVar244._16_4_ = 0xc2b0c0a5;
                auVar244._20_4_ = 0xc2b0c0a5;
                auVar244._24_4_ = 0xc2b0c0a5;
                auVar244._28_4_ = 0xc2b0c0a5;
                auVar89 = vmaxps_avx(auVar138,auVar244);
                auVar245._8_4_ = 0x3fb8aa3b;
                auVar245._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar245._12_4_ = 0x3fb8aa3b;
                auVar245._16_4_ = 0x3fb8aa3b;
                auVar245._20_4_ = 0x3fb8aa3b;
                auVar245._24_4_ = 0x3fb8aa3b;
                auVar245._28_4_ = 0x3fb8aa3b;
                auVar232 = vfmadd213ps_fma(auVar245,auVar89,auVar415);
                auVar87 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar138 = vcmpps_avx(ZEXT1632(auVar232),auVar87,1);
                auVar138 = vandps_avx(auVar138,auVar433);
                auVar138 = vsubps_avx(auVar87,auVar138);
                auVar232 = vfmsub231ps_fma(auVar89,auVar138,auVar459);
                auVar399 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar138,auVar453);
                auVar89 = ZEXT1632(auVar399);
                auVar20._28_4_ = auVar87._28_4_;
                auVar20._0_28_ =
                     ZEXT1628(CONCAT412(auVar399._12_4_ * auVar399._12_4_,
                                        CONCAT48(auVar399._8_4_ * auVar399._8_4_,
                                                 CONCAT44(auVar399._4_4_ * auVar399._4_4_,
                                                          auVar399._0_4_ * auVar399._0_4_))));
                auVar373._8_4_ = 0x3ab743ce;
                auVar373._0_8_ = 0x3ab743ce3ab743ce;
                auVar373._12_4_ = 0x3ab743ce;
                auVar373._16_4_ = 0x3ab743ce;
                auVar373._20_4_ = 0x3ab743ce;
                auVar373._24_4_ = 0x3ab743ce;
                auVar373._28_4_ = 0x3ab743ce;
                auVar232 = vfmadd213ps_fma(auVar372,auVar89,auVar373);
                auVar374._8_4_ = 0x3c088908;
                auVar374._0_8_ = 0x3c0889083c088908;
                auVar374._12_4_ = 0x3c088908;
                auVar374._16_4_ = 0x3c088908;
                auVar374._20_4_ = 0x3c088908;
                auVar374._24_4_ = 0x3c088908;
                auVar374._28_4_ = 0x3c088908;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar374);
                auVar95 = ZEXT864(0) << 0x20;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar346);
                auVar369 = ZEXT3264(auVar433);
                auVar89 = ZEXT1632(auVar399);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar463);
                auVar312 = ZEXT3264(auVar415);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar89,auVar415);
                auVar377 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar20,auVar89);
                auVar399._0_4_ = (int)auVar138._0_4_;
                auVar399._4_4_ = (int)auVar138._4_4_;
                auVar399._8_4_ = (int)auVar138._8_4_;
                auVar399._12_4_ = (int)auVar138._12_4_;
                auVar201._16_4_ = (int)auVar138._16_4_;
                auVar201._0_16_ = auVar399;
                auVar201._20_4_ = (int)auVar138._20_4_;
                auVar201._24_4_ = (int)auVar138._24_4_;
                auVar201._28_4_ = (int)auVar138._28_4_;
                auVar399 = vpslld_avx(auVar399,0x17);
                auVar232 = vpslld_avx(auVar201._16_16_,0x17);
                auVar232 = vpaddd_avx(auVar400,auVar232);
                auVar399 = vpaddd_avx(auVar400,auVar399);
                auVar202._16_16_ = auVar232;
                auVar202._0_16_ = auVar399;
                auVar246._0_4_ = auVar377._0_4_ + fVar78;
                auVar246._4_4_ = auVar377._4_4_ + fVar77;
                auVar246._8_4_ = auVar377._8_4_ + fVar1;
                auVar246._12_4_ = auVar377._12_4_ + fVar231;
                auVar246._16_4_ = fVar14 + 0.0;
                auVar246._20_4_ = fVar15 + 0.0;
                auVar246._24_4_ = fVar16 + 0.0;
                auVar246._28_4_ = fVar17 + 0.0;
                auVar232 = vfmadd213ps_fma(auVar202,auVar246,auVar433);
                auVar138 = vdivps_avx(auVar433,ZEXT1632(auVar232));
                auVar232 = vfnmadd213ps_fma(auVar138,auVar442,auVar398);
                auVar465 = ZEXT1664(auVar232);
                goto LAB_00271718;
              case 6:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar208._4_4_ = uVar79;
                auVar208._0_4_ = uVar79;
                auVar208._8_4_ = uVar79;
                auVar208._12_4_ = uVar79;
                auVar208._16_4_ = uVar79;
                auVar208._20_4_ = uVar79;
                auVar208._24_4_ = uVar79;
                auVar208._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar253._4_4_ = uVar79;
                auVar253._0_4_ = uVar79;
                auVar253._8_4_ = uVar79;
                auVar253._12_4_ = uVar79;
                auVar253._16_4_ = uVar79;
                auVar253._20_4_ = uVar79;
                auVar253._24_4_ = uVar79;
                auVar253._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar253,auVar89,auVar208);
                auVar138 = vmaxps_avx(ZEXT1632(auVar232),auVar87);
                auVar138 = vminps_avx(auVar138,auVar433);
                auVar465 = ZEXT3264(auVar138);
LAB_00271718:
                auVar146._0_4_ = auVar465._0_4_ * auVar145._0_4_;
                auVar146._4_4_ = auVar465._4_4_ * auVar145._4_4_;
                auVar146._8_4_ = auVar465._8_4_ * auVar145._8_4_;
                auVar146._12_4_ = auVar465._12_4_ * auVar145._12_4_;
                auVar146._16_4_ = auVar465._16_4_ * auVar145._16_4_;
                auVar146._20_4_ = auVar465._20_4_ * auVar145._20_4_;
                auVar146._28_36_ = auVar465._28_36_;
                auVar146._24_4_ = auVar465._24_4_ * auVar145._24_4_;
                auVar138 = auVar146._0_32_;
              }
switchD_002712f4_caseD_1:
              *local_240 = auVar138;
              local_240 = local_240 + 1;
              iVar55 = iVar55 + 1;
            }
          }
        }
      }
      if ((iVar70 == 4) && (uVar50 == 8)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar71 = 0;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar65 = 0;
        if (0 < (int)uVar7) {
          uVar65 = (ulong)uVar7;
        }
        uVar67 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar67 = uVar71;
        }
        auVar369 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar95 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar145 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar88._8_4_ = 0x3f800000;
        auVar88._0_8_ = 0x3f8000003f800000;
        auVar88._12_4_ = 0x3f800000;
        auVar88._16_4_ = 0x3f800000;
        auVar88._20_4_ = 0x3f800000;
        auVar88._24_4_ = 0x3f800000;
        auVar88._28_4_ = 0x3f800000;
        auVar465 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar312 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar392._8_4_ = 0x3f318000;
        auVar392._0_8_ = 0x3f3180003f318000;
        auVar392._12_4_ = 0x3f318000;
        auVar392._16_4_ = 0x3f318000;
        auVar392._20_4_ = 0x3f318000;
        auVar392._24_4_ = 0x3f318000;
        auVar392._28_4_ = 0x3f318000;
        for (; uVar71 != uVar67; uVar71 = uVar71 + 1) {
          local_240 = (undefined1 (*) [32])
                      (local_198.cstep * uVar71 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar72 = 0;
          uVar41 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar41 = uVar72;
          }
          uVar36 = local_198.w;
          if (local_198.w < 1) {
            uVar36 = 0;
          }
          uVar46 = local_198.h;
          if (local_198.h < 1) {
            uVar46 = 0;
          }
          while (uVar69 = (uint)uVar72, uVar69 != uVar46) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar37 = 0; uVar37 != uVar36; uVar37 = uVar37 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar146 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar146 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar11 + uVar71 * 0x20));
              }
              pvVar75 = bottom_blob->data;
              lVar43 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar71 * (this->weight_data_tm).elemsize +
                       0x60;
              for (uVar72 = 0; uVar72 != uVar41; uVar72 = uVar72 + 1) {
                lVar53 = lVar43;
                for (uVar73 = 0; uVar73 != uVar65; uVar73 = uVar73 + 1) {
                  iVar34 = (((int)uVar73 - uVar7) + 1) * iVar48 + uVar69;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    lVar45 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar72;
                    iVar34 = iVar55;
                    for (lVar56 = 0; uVar54 * 0x80 != lVar56; lVar56 = lVar56 + 0x80) {
                      if (((-1 < iVar34) && (iVar51 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar51 < iVar68)) {
                        lVar40 = (long)(iVar51 << 2);
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45);
                        auVar209._4_4_ = uVar79;
                        auVar209._0_4_ = uVar79;
                        auVar209._8_4_ = uVar79;
                        auVar209._12_4_ = uVar79;
                        auVar209._16_4_ = uVar79;
                        auVar209._20_4_ = uVar79;
                        auVar209._24_4_ = uVar79;
                        auVar209._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 4);
                        auVar254._4_4_ = uVar79;
                        auVar254._0_4_ = uVar79;
                        auVar254._8_4_ = uVar79;
                        auVar254._12_4_ = uVar79;
                        auVar254._16_4_ = uVar79;
                        auVar254._20_4_ = uVar79;
                        auVar254._24_4_ = uVar79;
                        auVar254._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 8);
                        auVar325._4_4_ = uVar79;
                        auVar325._0_4_ = uVar79;
                        auVar325._8_4_ = uVar79;
                        auVar325._12_4_ = uVar79;
                        auVar325._16_4_ = uVar79;
                        auVar325._20_4_ = uVar79;
                        auVar325._24_4_ = uVar79;
                        auVar325._28_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0xc);
                        auVar420._4_4_ = uVar79;
                        auVar420._0_4_ = uVar79;
                        auVar420._8_4_ = uVar79;
                        auVar420._12_4_ = uVar79;
                        auVar420._16_4_ = uVar79;
                        auVar420._20_4_ = uVar79;
                        auVar420._24_4_ = uVar79;
                        auVar420._28_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar146._0_32_,auVar209,
                                                   *(undefined1 (*) [32])(lVar53 + -0x60 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar254,
                                                   *(undefined1 (*) [32])(lVar53 + -0x40 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar325,
                                                   *(undefined1 (*) [32])(lVar53 + -0x20 + lVar56));
                        auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar420,
                                                   *(undefined1 (*) [32])(lVar53 + lVar56));
                        auVar146 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  lVar53 = lVar53 + (long)(int)uVar39 * 0x80;
                }
                lVar43 = lVar43 + (long)(int)(uVar39 * uVar7 * 0x20) * 4;
              }
              auVar138 = auVar146._0_32_;
              auVar463 = auVar138;
              if (5 < iVar49 - 1U) goto switchD_00271ae0_caseD_1;
              auVar463 = vmaxps_avx(auVar138,_DAT_00539a00);
              auVar89 = auVar95._0_32_;
              auVar451 = auVar465._0_32_;
              auVar87 = auVar312._0_32_;
              auVar415 = auVar369._0_32_;
              auVar433 = auVar145._0_32_;
              switch(iVar49) {
              case 2:
                auVar138 = vminps_avx(auVar138,_DAT_00539a00);
                uVar79 = *(this->super_Deconvolution).activation_params.data;
                auVar477._4_4_ = uVar79;
                auVar477._0_4_ = uVar79;
                auVar477._8_4_ = uVar79;
                auVar477._12_4_ = uVar79;
                auVar477._16_4_ = uVar79;
                auVar477._20_4_ = uVar79;
                auVar477._24_4_ = uVar79;
                auVar477._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar463,auVar138,auVar477);
                auVar463 = ZEXT1632(auVar232);
                break;
              case 3:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar216._4_4_ = uVar79;
                auVar216._0_4_ = uVar79;
                auVar216._8_4_ = uVar79;
                auVar216._12_4_ = uVar79;
                auVar216._16_4_ = uVar79;
                auVar216._20_4_ = uVar79;
                auVar216._24_4_ = uVar79;
                auVar216._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar480._4_4_ = uVar79;
                auVar480._0_4_ = uVar79;
                auVar480._8_4_ = uVar79;
                auVar480._12_4_ = uVar79;
                auVar480._16_4_ = uVar79;
                auVar480._20_4_ = uVar79;
                auVar480._24_4_ = uVar79;
                auVar480._28_4_ = uVar79;
                auVar463 = vmaxps_avx(auVar138,auVar216);
                auVar463 = vminps_avx(auVar480,auVar463);
                break;
              case 4:
                auVar137._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
                auVar137._8_4_ = -auVar146._8_4_;
                auVar137._12_4_ = -auVar146._12_4_;
                auVar137._16_4_ = -auVar146._16_4_;
                auVar137._20_4_ = -auVar146._20_4_;
                auVar137._24_4_ = -auVar146._24_4_;
                auVar137._28_4_ = auVar146._28_4_ ^ 0x80000000;
                auVar217._8_4_ = 0x42b0c0a5;
                auVar217._0_8_ = 0x42b0c0a542b0c0a5;
                auVar217._12_4_ = 0x42b0c0a5;
                auVar217._16_4_ = 0x42b0c0a5;
                auVar217._20_4_ = 0x42b0c0a5;
                auVar217._24_4_ = 0x42b0c0a5;
                auVar217._28_4_ = 0x42b0c0a5;
                auVar463 = vminps_avx(auVar137,auVar217);
                auVar138 = vmaxps_avx(auVar415,auVar463);
                auVar232 = vfmadd213ps_fma(auVar433,auVar138,auVar89);
                auVar415 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar415,1);
                auVar463 = vandps_avx(auVar463,auVar88);
                auVar463 = vsubps_avx(auVar415,auVar463);
                auVar261._8_4_ = 0x3f318000;
                auVar261._0_8_ = 0x3f3180003f318000;
                auVar261._12_4_ = 0x3f318000;
                auVar261._16_4_ = 0x3f318000;
                auVar261._20_4_ = 0x3f318000;
                auVar261._24_4_ = 0x3f318000;
                auVar261._28_4_ = 0x3f318000;
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar261);
                auVar262._8_4_ = 0x395e8083;
                auVar262._0_8_ = 0x395e8083395e8083;
                auVar262._12_4_ = 0x395e8083;
                auVar262._16_4_ = 0x395e8083;
                auVar262._20_4_ = 0x395e8083;
                auVar262._24_4_ = 0x395e8083;
                auVar262._28_4_ = 0x395e8083;
                auVar400 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar262);
                auVar138 = ZEXT1632(auVar400);
                auVar25._28_4_ = auVar415._28_4_;
                auVar25._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar263._8_4_ = 0x3ab743ce;
                auVar263._0_8_ = 0x3ab743ce3ab743ce;
                auVar263._12_4_ = 0x3ab743ce;
                auVar263._16_4_ = 0x3ab743ce;
                auVar263._20_4_ = 0x3ab743ce;
                auVar263._24_4_ = 0x3ab743ce;
                auVar263._28_4_ = 0x3ab743ce;
                auVar232 = vfmadd213ps_fma(auVar451,auVar138,auVar263);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar264._8_4_ = 0x3d2aa9c1;
                auVar264._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar264._12_4_ = 0x3d2aa9c1;
                auVar264._16_4_ = 0x3d2aa9c1;
                auVar264._20_4_ = 0x3d2aa9c1;
                auVar264._24_4_ = 0x3d2aa9c1;
                auVar264._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar264);
                auVar265._8_4_ = 0x3e2aaaaa;
                auVar265._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar265._12_4_ = 0x3e2aaaaa;
                auVar265._16_4_ = 0x3e2aaaaa;
                auVar265._20_4_ = 0x3e2aaaaa;
                auVar265._24_4_ = 0x3e2aaaaa;
                auVar265._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar265);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar89);
                auVar399 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar25,auVar138);
                auVar97._0_4_ = (int)auVar463._0_4_;
                auVar97._4_4_ = (int)auVar463._4_4_;
                auVar97._8_4_ = (int)auVar463._8_4_;
                auVar97._12_4_ = (int)auVar463._12_4_;
                auVar139._16_4_ = (int)auVar463._16_4_;
                auVar139._0_16_ = auVar97;
                auVar139._20_4_ = (int)auVar463._20_4_;
                auVar139._24_4_ = (int)auVar463._24_4_;
                auVar139._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar97,0x17);
                auVar232 = vpslld_avx(auVar139._16_16_,0x17);
                auVar235._8_4_ = 0x3f800000;
                auVar235._0_8_ = 0x3f8000003f800000;
                auVar235._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar235);
                auVar400 = vpaddd_avx(auVar400,auVar235);
                auVar140._16_16_ = auVar232;
                auVar140._0_16_ = auVar400;
                auVar218._0_4_ = auVar399._0_4_ + 1.0;
                auVar218._4_4_ = auVar399._4_4_ + 1.0;
                auVar218._8_4_ = auVar399._8_4_ + 1.0;
                auVar218._12_4_ = auVar399._12_4_ + 1.0;
                auVar218._16_4_ = 0x3f800000;
                auVar218._20_4_ = 0x3f800000;
                auVar218._24_4_ = 0x3f800000;
                auVar218._28_4_ = 0x3f800000;
                auVar232 = vfmadd213ps_fma(auVar140,auVar218,auVar88);
                auVar463 = vdivps_avx(auVar88,ZEXT1632(auVar232));
                break;
              case 5:
                auVar443._8_4_ = 0x42b0c0a5;
                auVar443._0_8_ = 0x42b0c0a542b0c0a5;
                auVar443._12_4_ = 0x42b0c0a5;
                auVar443._16_4_ = 0x42b0c0a5;
                auVar443._20_4_ = 0x42b0c0a5;
                auVar443._24_4_ = 0x42b0c0a5;
                auVar443._28_4_ = 0x42b0c0a5;
                auVar463 = vminps_avx(auVar443,auVar138);
                auVar138 = vmaxps_avx(auVar415,auVar463);
                auVar232 = vfmadd213ps_fma(auVar433,auVar138,auVar89);
                auVar457 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar457,1);
                auVar463 = vandps_avx(auVar463,auVar88);
                auVar463 = vsubps_avx(auVar457,auVar463);
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar392);
                auVar255._8_4_ = 0xb95e8083;
                auVar255._0_8_ = 0xb95e8083b95e8083;
                auVar255._12_4_ = 0xb95e8083;
                auVar255._16_4_ = 0xb95e8083;
                auVar255._20_4_ = 0xb95e8083;
                auVar255._24_4_ = 0xb95e8083;
                auVar255._28_4_ = 0xb95e8083;
                auVar400 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar255);
                auVar138 = ZEXT1632(auVar400);
                auVar22._28_4_ = auVar457._28_4_;
                auVar22._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar464._8_4_ = 0x3ab743ce;
                auVar464._0_8_ = 0x3ab743ce3ab743ce;
                auVar464._12_4_ = 0x3ab743ce;
                auVar464._16_4_ = 0x3ab743ce;
                auVar464._20_4_ = 0x3ab743ce;
                auVar464._24_4_ = 0x3ab743ce;
                auVar464._28_4_ = 0x3ab743ce;
                auVar232 = vfmadd213ps_fma(auVar451,auVar138,auVar464);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar347._8_4_ = 0x3d2aa9c1;
                auVar347._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar347._12_4_ = 0x3d2aa9c1;
                auVar347._16_4_ = 0x3d2aa9c1;
                auVar347._20_4_ = 0x3d2aa9c1;
                auVar347._24_4_ = 0x3d2aa9c1;
                auVar347._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar347);
                auVar326._8_4_ = 0x3e2aaaaa;
                auVar326._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar326._12_4_ = 0x3e2aaaaa;
                auVar326._16_4_ = 0x3e2aaaaa;
                auVar326._20_4_ = 0x3e2aaaaa;
                auVar326._24_4_ = 0x3e2aaaaa;
                auVar326._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar326);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar89);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar22,auVar138);
                auVar210._0_4_ = auVar232._0_4_ + 1.0;
                auVar210._4_4_ = auVar232._4_4_ + 1.0;
                auVar210._8_4_ = auVar232._8_4_ + 1.0;
                auVar210._12_4_ = auVar232._12_4_ + 1.0;
                auVar210._16_4_ = 0x3f800000;
                auVar210._20_4_ = 0x3f800000;
                auVar210._24_4_ = 0x3f800000;
                auVar210._28_4_ = 0x3f800000;
                auVar234._0_4_ = (int)auVar463._0_4_;
                auVar234._4_4_ = (int)auVar463._4_4_;
                auVar234._8_4_ = (int)auVar463._8_4_;
                auVar234._12_4_ = (int)auVar463._12_4_;
                auVar256._16_4_ = (int)auVar463._16_4_;
                auVar256._0_16_ = auVar234;
                auVar256._20_4_ = (int)auVar463._20_4_;
                auVar256._24_4_ = (int)auVar463._24_4_;
                auVar256._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar234,0x17);
                auVar232 = vpslld_avx(auVar256._16_16_,0x17);
                auVar313._8_4_ = 0x3f800000;
                auVar313._0_8_ = 0x3f8000003f800000;
                auVar313._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar313);
                auVar400 = vpaddd_avx(auVar400,auVar313);
                auVar478._16_16_ = auVar232;
                auVar478._0_16_ = auVar400;
                auVar399 = vfmadd213ps_fma(auVar478,auVar210,auVar88);
                auVar211._8_4_ = 0x800000;
                auVar211._0_8_ = 0x80000000800000;
                auVar211._12_4_ = 0x800000;
                auVar211._16_4_ = 0x800000;
                auVar211._20_4_ = 0x800000;
                auVar211._24_4_ = 0x800000;
                auVar211._28_4_ = 0x800000;
                auVar463 = vmaxps_avx(ZEXT1632(auVar399),auVar211);
                auVar400 = vpsrld_avx(auVar463._0_16_,0x17);
                auVar232 = vpsrld_avx(auVar463._16_16_,0x17);
                auVar327._8_4_ = 0x807fffff;
                auVar327._0_8_ = 0x807fffff807fffff;
                auVar327._12_4_ = 0x807fffff;
                auVar327._16_4_ = 0x807fffff;
                auVar327._20_4_ = 0x807fffff;
                auVar327._24_4_ = 0x807fffff;
                auVar327._28_4_ = 0x807fffff;
                auVar463 = vandps_avx(auVar463,auVar327);
                auVar89 = vorps_avx(auVar463,auVar89);
                auVar328._8_4_ = 0x3f3504f3;
                auVar328._0_8_ = 0x3f3504f33f3504f3;
                auVar328._12_4_ = 0x3f3504f3;
                auVar328._16_4_ = 0x3f3504f3;
                auVar328._20_4_ = 0x3f3504f3;
                auVar328._24_4_ = 0x3f3504f3;
                auVar328._28_4_ = 0x3f3504f3;
                auVar138 = vcmpps_avx(auVar328,auVar89,2);
                auVar463 = vandnps_avx(auVar138,auVar89);
                auVar212._0_4_ = auVar463._0_4_ + auVar89._0_4_ + -1.0;
                auVar212._4_4_ = auVar463._4_4_ + auVar89._4_4_ + -1.0;
                auVar212._8_4_ = auVar463._8_4_ + auVar89._8_4_ + -1.0;
                auVar212._12_4_ = auVar463._12_4_ + auVar89._12_4_ + -1.0;
                auVar212._16_4_ = auVar463._16_4_ + auVar89._16_4_ + -1.0;
                auVar212._20_4_ = auVar463._20_4_ + auVar89._20_4_ + -1.0;
                auVar212._24_4_ = auVar463._24_4_ + auVar89._24_4_ + -1.0;
                auVar212._28_4_ = auVar463._28_4_ + auVar89._28_4_ + -1.0;
                auVar232 = vpsubd_avx(auVar232,auVar138._16_16_);
                auVar425._8_4_ = 0xffffff81;
                auVar425._0_8_ = 0xffffff81ffffff81;
                auVar425._12_4_ = 0xffffff81;
                auVar232 = vpaddd_avx(auVar232,auVar425);
                auVar400 = vpsubd_avx(auVar400,auVar138._0_16_);
                auVar400 = vpaddd_avx(auVar425,auVar400);
                auVar257._16_16_ = auVar232;
                auVar257._0_16_ = auVar400;
                auVar23._4_4_ = auVar212._4_4_ * auVar212._4_4_;
                auVar23._0_4_ = auVar212._0_4_ * auVar212._0_4_;
                auVar23._8_4_ = auVar212._8_4_ * auVar212._8_4_;
                auVar23._12_4_ = auVar212._12_4_ * auVar212._12_4_;
                auVar23._16_4_ = auVar212._16_4_ * auVar212._16_4_;
                auVar23._20_4_ = auVar212._20_4_ * auVar212._20_4_;
                auVar23._24_4_ = auVar212._24_4_ * auVar212._24_4_;
                auVar23._28_4_ = auVar138._28_4_;
                auVar421._8_4_ = 0x3d9021bb;
                auVar421._0_8_ = 0x3d9021bb3d9021bb;
                auVar421._12_4_ = 0x3d9021bb;
                auVar421._16_4_ = 0x3d9021bb;
                auVar421._20_4_ = 0x3d9021bb;
                auVar421._24_4_ = 0x3d9021bb;
                auVar421._28_4_ = 0x3d9021bb;
                auVar348._8_4_ = 0xbdebd1b8;
                auVar348._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar348._12_4_ = 0xbdebd1b8;
                auVar348._16_4_ = 0xbdebd1b8;
                auVar348._20_4_ = 0xbdebd1b8;
                auVar348._24_4_ = 0xbdebd1b8;
                auVar348._28_4_ = 0xbdebd1b8;
                auVar232 = vfmadd213ps_fma(auVar421,auVar212,auVar348);
                auVar349._8_4_ = 0x3def251a;
                auVar349._0_8_ = 0x3def251a3def251a;
                auVar349._12_4_ = 0x3def251a;
                auVar349._16_4_ = 0x3def251a;
                auVar349._20_4_ = 0x3def251a;
                auVar349._24_4_ = 0x3def251a;
                auVar349._28_4_ = 0x3def251a;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar349);
                auVar350._8_4_ = 0xbdfe5d4f;
                auVar350._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar350._12_4_ = 0xbdfe5d4f;
                auVar350._16_4_ = 0xbdfe5d4f;
                auVar350._20_4_ = 0xbdfe5d4f;
                auVar350._24_4_ = 0xbdfe5d4f;
                auVar350._28_4_ = 0xbdfe5d4f;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar350);
                auVar351._8_4_ = 0x3e11e9bf;
                auVar351._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar351._12_4_ = 0x3e11e9bf;
                auVar351._16_4_ = 0x3e11e9bf;
                auVar351._20_4_ = 0x3e11e9bf;
                auVar351._24_4_ = 0x3e11e9bf;
                auVar351._28_4_ = 0x3e11e9bf;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar351);
                auVar352._8_4_ = 0xbe2aae50;
                auVar352._0_8_ = 0xbe2aae50be2aae50;
                auVar352._12_4_ = 0xbe2aae50;
                auVar352._16_4_ = 0xbe2aae50;
                auVar352._20_4_ = 0xbe2aae50;
                auVar352._24_4_ = 0xbe2aae50;
                auVar352._28_4_ = 0xbe2aae50;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar352);
                auVar353._8_4_ = 0x3e4cceac;
                auVar353._0_8_ = 0x3e4cceac3e4cceac;
                auVar353._12_4_ = 0x3e4cceac;
                auVar353._16_4_ = 0x3e4cceac;
                auVar353._20_4_ = 0x3e4cceac;
                auVar353._24_4_ = 0x3e4cceac;
                auVar353._28_4_ = 0x3e4cceac;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar353);
                auVar354._8_4_ = 0xbe7ffffc;
                auVar354._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar354._12_4_ = 0xbe7ffffc;
                auVar354._16_4_ = 0xbe7ffffc;
                auVar354._20_4_ = 0xbe7ffffc;
                auVar354._24_4_ = 0xbe7ffffc;
                auVar354._28_4_ = 0xbe7ffffc;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar354);
                auVar355._8_4_ = 0x3eaaaaaa;
                auVar355._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar355._12_4_ = 0x3eaaaaaa;
                auVar355._16_4_ = 0x3eaaaaaa;
                auVar355._20_4_ = 0x3eaaaaaa;
                auVar355._24_4_ = 0x3eaaaaaa;
                auVar355._28_4_ = 0x3eaaaaaa;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar212,auVar355);
                auVar422._0_4_ = auVar212._0_4_ * auVar212._0_4_ * auVar212._0_4_ * auVar232._0_4_;
                auVar422._4_4_ = auVar212._4_4_ * auVar212._4_4_ * auVar212._4_4_ * auVar232._4_4_;
                auVar422._8_4_ = auVar212._8_4_ * auVar212._8_4_ * auVar212._8_4_ * auVar232._8_4_;
                auVar422._12_4_ =
                     auVar212._12_4_ * auVar212._12_4_ * auVar212._12_4_ * auVar232._12_4_;
                auVar422._16_4_ = auVar212._16_4_ * auVar212._16_4_ * auVar212._16_4_ * 0.0;
                auVar422._20_4_ = auVar212._20_4_ * auVar212._20_4_ * auVar212._20_4_ * 0.0;
                auVar422._24_4_ = auVar212._24_4_ * auVar212._24_4_ * auVar212._24_4_ * 0.0;
                auVar422._28_4_ = 0;
                auVar356._8_4_ = 0x3f000000;
                auVar356._0_8_ = 0x3f0000003f000000;
                auVar356._12_4_ = 0x3f000000;
                auVar356._16_4_ = 0x3f000000;
                auVar356._20_4_ = 0x3f000000;
                auVar356._24_4_ = 0x3f000000;
                auVar356._28_4_ = 0x3f000000;
                auVar138 = vcvtdq2ps_avx(auVar257);
                auVar444._8_4_ = 0xb95e8083;
                auVar444._0_8_ = 0xb95e8083b95e8083;
                auVar444._12_4_ = 0xb95e8083;
                auVar444._16_4_ = 0xb95e8083;
                auVar444._20_4_ = 0xb95e8083;
                auVar444._24_4_ = 0xb95e8083;
                auVar444._28_4_ = 0xb95e8083;
                auVar232 = vfmadd231ps_fma(auVar422,auVar138,auVar444);
                auVar232 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar356,auVar23);
                auVar463 = vcmpps_avx(ZEXT1632(auVar399),_DAT_00539a00,2);
                auVar89 = vsubps_avx(ZEXT1632(auVar232),auVar212);
                auVar232 = vfmsub231ps_fma(auVar89,auVar392,auVar138);
                auVar479._8_4_ = 0xc0000000;
                auVar479._0_8_ = 0xc0000000c0000000;
                auVar479._12_4_ = 0xc0000000;
                auVar479._16_4_ = 0xc0000000;
                auVar479._20_4_ = 0xc0000000;
                auVar479._24_4_ = 0xc0000000;
                auVar479._28_4_ = 0xc0000000;
                auVar213._0_4_ = auVar232._0_4_ * -2.0;
                auVar213._4_4_ = auVar232._4_4_ * -2.0;
                auVar213._8_4_ = auVar232._8_4_ * -2.0;
                auVar213._12_4_ = auVar232._12_4_ * -2.0;
                auVar213._16_4_ = 0x80000000;
                auVar213._20_4_ = 0x80000000;
                auVar213._24_4_ = 0x80000000;
                auVar213._28_4_ = 0;
                auVar258._8_4_ = 0x7fffffff;
                auVar258._0_8_ = 0x7fffffff7fffffff;
                auVar258._12_4_ = 0x7fffffff;
                auVar258._16_4_ = 0x7fffffff;
                auVar258._20_4_ = 0x7fffffff;
                auVar258._24_4_ = 0x7fffffff;
                auVar258._28_4_ = 0x7fffffff;
                auVar463 = vblendvps_avx(auVar213,auVar258,auVar463);
                auVar463 = vminps_avx(auVar443,auVar463);
                auVar369 = ZEXT3264(auVar415);
                auVar138 = vmaxps_avx(auVar415,auVar463);
                auVar145 = ZEXT3264(auVar433);
                auVar232 = vfmadd213ps_fma(auVar433,auVar138,auVar356);
                auVar89 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar89,1);
                auVar463 = vandps_avx(auVar463,auVar88);
                auVar463 = vsubps_avx(auVar89,auVar463);
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar392);
                auVar329._8_4_ = 0xb95e8083;
                auVar329._0_8_ = 0xb95e8083b95e8083;
                auVar329._12_4_ = 0xb95e8083;
                auVar329._16_4_ = 0xb95e8083;
                auVar329._20_4_ = 0xb95e8083;
                auVar329._24_4_ = 0xb95e8083;
                auVar329._28_4_ = 0xb95e8083;
                auVar400 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar329);
                auVar138 = ZEXT1632(auVar400);
                auVar24._28_4_ = 0xb95e8083;
                auVar24._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar465 = ZEXT3264(auVar451);
                auVar232 = vfmadd213ps_fma(auVar451,auVar138,auVar464);
                auVar312 = ZEXT3264(auVar87);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar310._8_4_ = 0x3d2aa9c1;
                auVar310._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar310._12_4_ = 0x3d2aa9c1;
                auVar310._16_4_ = 0x3d2aa9c1;
                auVar310._20_4_ = 0x3d2aa9c1;
                auVar310._24_4_ = 0x3d2aa9c1;
                auVar310._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar310);
                auVar311._8_4_ = 0x3e2aaaaa;
                auVar311._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar311._12_4_ = 0x3e2aaaaa;
                auVar311._16_4_ = 0x3e2aaaaa;
                auVar311._20_4_ = 0x3e2aaaaa;
                auVar311._24_4_ = 0x3e2aaaaa;
                auVar311._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar311);
                auVar95 = ZEXT3264(auVar356);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar356);
                auVar399 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar24,auVar138);
                auVar148._0_4_ = (int)auVar463._0_4_;
                auVar148._4_4_ = (int)auVar463._4_4_;
                auVar148._8_4_ = (int)auVar463._8_4_;
                auVar148._12_4_ = (int)auVar463._12_4_;
                auVar214._16_4_ = (int)auVar463._16_4_;
                auVar214._0_16_ = auVar148;
                auVar214._20_4_ = (int)auVar463._20_4_;
                auVar214._24_4_ = (int)auVar463._24_4_;
                auVar214._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar148,0x17);
                auVar232 = vpslld_avx(auVar214._16_16_,0x17);
                auVar122._8_4_ = 0x3f800000;
                auVar122._0_8_ = 0x3f8000003f800000;
                auVar122._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar122);
                auVar400 = vpaddd_avx(auVar400,auVar122);
                auVar215._16_16_ = auVar232;
                auVar215._0_16_ = auVar400;
                auVar259._0_4_ = auVar399._0_4_ + 1.0;
                auVar259._4_4_ = auVar399._4_4_ + 1.0;
                auVar259._8_4_ = auVar399._8_4_ + 1.0;
                auVar259._12_4_ = auVar399._12_4_ + 1.0;
                auVar259._16_4_ = 0x3f800000;
                auVar259._20_4_ = 0x3f800000;
                auVar259._24_4_ = 0x3f800000;
                auVar259._28_4_ = 0x3f800000;
                auVar232 = vfmadd213ps_fma(auVar215,auVar259,auVar88);
                auVar463 = vdivps_avx(auVar88,ZEXT1632(auVar232));
                auVar260._8_4_ = 0xbf800000;
                auVar260._0_8_ = 0xbf800000bf800000;
                auVar260._12_4_ = 0xbf800000;
                auVar260._16_4_ = 0xbf800000;
                auVar260._20_4_ = 0xbf800000;
                auVar260._24_4_ = 0xbf800000;
                auVar260._28_4_ = 0xbf800000;
                auVar232 = vfnmadd213ps_fma(auVar463,auVar479,auVar260);
                auVar454 = ZEXT1664(auVar232);
                goto LAB_00271f0b;
              case 6:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar219._4_4_ = uVar79;
                auVar219._0_4_ = uVar79;
                auVar219._8_4_ = uVar79;
                auVar219._12_4_ = uVar79;
                auVar219._16_4_ = uVar79;
                auVar219._20_4_ = uVar79;
                auVar219._24_4_ = uVar79;
                auVar219._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar266._4_4_ = uVar79;
                auVar266._0_4_ = uVar79;
                auVar266._8_4_ = uVar79;
                auVar266._12_4_ = uVar79;
                auVar266._16_4_ = uVar79;
                auVar266._20_4_ = uVar79;
                auVar266._24_4_ = uVar79;
                auVar266._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar266,auVar138,auVar219);
                auVar463 = vmaxps_avx(ZEXT1632(auVar232),_DAT_00539a00);
                auVar463 = vminps_avx(auVar463,auVar88);
                auVar454 = ZEXT3264(auVar463);
LAB_00271f0b:
                auVar460._0_4_ = auVar454._0_4_ * auVar146._0_4_;
                auVar460._4_4_ = auVar454._4_4_ * auVar146._4_4_;
                auVar460._8_4_ = auVar454._8_4_ * auVar146._8_4_;
                auVar460._12_4_ = auVar454._12_4_ * auVar146._12_4_;
                auVar460._16_4_ = auVar454._16_4_ * auVar146._16_4_;
                auVar460._20_4_ = auVar454._20_4_ * auVar146._20_4_;
                auVar460._28_36_ = auVar454._28_36_;
                auVar460._24_4_ = auVar454._24_4_ * auVar146._24_4_;
                auVar463 = auVar460._0_32_;
              }
switchD_00271ae0_caseD_1:
              *local_240 = auVar463;
              local_240 = local_240 + 1;
              iVar55 = iVar55 + 1;
            }
            uVar72 = (ulong)(uVar69 + 1);
          }
        }
      }
      if ((iVar70 == 8) && (uVar50 == 4)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar71 = 0;
        if (0 < (int)uVar7) {
          uVar71 = (ulong)uVar7;
        }
        uVar65 = 0;
        uVar36 = local_198.c;
        if (local_198.c < 1) {
          uVar36 = 0;
        }
        auVar312 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar95 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = 0x3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar461._8_4_ = 0x3ab743ce;
        auVar461._0_8_ = 0x3ab743ce3ab743ce;
        auVar461._12_4_ = 0x3ab743ce;
        for (; uVar65 != uVar36; uVar65 = uVar65 + 1) {
          local_1e8 = (undefined1 (*) [16])
                      (local_198.cstep * uVar65 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar46 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar46 = 0;
          }
          uVar37 = 0;
          uVar69 = local_198.w;
          if (local_198.w < 1) {
            uVar69 = 0;
          }
          uVar35 = local_198.h;
          if (local_198.h < 1) {
            uVar35 = 0;
          }
          for (; uVar37 != uVar35; uVar37 = uVar37 + 1) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar61 = 0; uVar61 != uVar69; uVar61 = uVar61 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar232 = ZEXT816(0) << 0x40;
              }
              else {
                auVar232 = *(undefined1 (*) [16])((long)pvVar11 + uVar65 * 0x10);
              }
              auVar369 = ZEXT1664(auVar232);
              pvVar75 = bottom_blob->data;
              lVar43 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar65 * (this->weight_data_tm).elemsize +
                       0x70;
              for (uVar67 = 0; uVar67 != uVar46; uVar67 = uVar67 + 1) {
                lVar53 = lVar43;
                for (uVar41 = 0; uVar41 != uVar71; uVar41 = uVar41 + 1) {
                  iVar34 = (((int)uVar41 - uVar7) + 1) * iVar48 + uVar37;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    lVar45 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar67;
                    iVar34 = iVar55;
                    for (lVar56 = 0; uVar54 * 0x80 != lVar56; lVar56 = lVar56 + 0x80) {
                      if (((-1 < iVar34) && (iVar51 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar51 < iVar68)) {
                        lVar40 = (long)(iVar51 << 3);
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45);
                        auVar98._4_4_ = uVar79;
                        auVar98._0_4_ = uVar79;
                        auVar98._8_4_ = uVar79;
                        auVar98._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 4);
                        auVar149._4_4_ = uVar79;
                        auVar149._0_4_ = uVar79;
                        auVar149._8_4_ = uVar79;
                        auVar149._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 8);
                        auVar276._4_4_ = uVar79;
                        auVar276._0_4_ = uVar79;
                        auVar276._8_4_ = uVar79;
                        auVar276._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0xc);
                        auVar375._4_4_ = uVar79;
                        auVar375._0_4_ = uVar79;
                        auVar375._8_4_ = uVar79;
                        auVar375._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x10);
                        auVar393._4_4_ = uVar79;
                        auVar393._0_4_ = uVar79;
                        auVar393._8_4_ = uVar79;
                        auVar393._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x14);
                        auVar401._4_4_ = uVar79;
                        auVar401._0_4_ = uVar79;
                        auVar401._8_4_ = uVar79;
                        auVar401._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x18);
                        auVar426._4_4_ = uVar79;
                        auVar426._0_4_ = uVar79;
                        auVar426._8_4_ = uVar79;
                        auVar426._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0x1c);
                        auVar447._4_4_ = uVar79;
                        auVar447._0_4_ = uVar79;
                        auVar447._8_4_ = uVar79;
                        auVar447._12_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar369._0_16_,auVar98,
                                                   *(undefined1 (*) [16])(lVar53 + -0x70 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar149,
                                                   *(undefined1 (*) [16])(lVar53 + -0x60 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar276,
                                                   *(undefined1 (*) [16])(lVar53 + -0x50 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar375,
                                                   *(undefined1 (*) [16])(lVar53 + -0x40 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar393,
                                                   *(undefined1 (*) [16])(lVar53 + -0x30 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar401,
                                                   *(undefined1 (*) [16])(lVar53 + -0x20 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar426,
                                                   *(undefined1 (*) [16])(lVar53 + -0x10 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar447,
                                                   *(undefined1 (*) [16])(lVar53 + lVar56));
                        auVar369 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  lVar53 = lVar53 + (long)(int)uVar39 * 0x80;
                }
                lVar43 = lVar43 + (long)(int)(uVar39 * uVar7 * 0x20) * 4;
              }
              auVar232 = auVar369._0_16_;
              if (iVar49 - 1U < 6) {
                auVar399 = auVar312._0_16_;
                auVar106 = vmaxps_avx(auVar232,auVar399);
                auVar400 = auVar95._0_16_;
                switch(iVar49) {
                case 2:
                  auVar232 = vminps_avx(auVar232,auVar399);
                  uVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar376._4_4_ = uVar79;
                  auVar376._0_4_ = uVar79;
                  auVar376._8_4_ = uVar79;
                  auVar376._12_4_ = uVar79;
                  auVar106 = vfmadd231ps_fma(auVar106,auVar232,auVar376);
                  break;
                case 3:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar102._4_4_ = uVar79;
                  auVar102._0_4_ = uVar79;
                  auVar102._8_4_ = uVar79;
                  auVar102._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar378._4_4_ = uVar79;
                  auVar378._0_4_ = uVar79;
                  auVar378._8_4_ = uVar79;
                  auVar378._12_4_ = uVar79;
                  auVar232 = vmaxps_avx(auVar232,auVar102);
                  auVar106 = vminps_avx(auVar378,auVar232);
                  break;
                case 4:
                  auVar103._0_8_ = auVar369._0_8_ ^ 0x8000000080000000;
                  auVar103._8_4_ = -auVar369._8_4_;
                  auVar103._12_4_ = -auVar369._12_4_;
                  auVar157._8_4_ = 0x42b0c0a5;
                  auVar157._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar157._12_4_ = 0x42b0c0a5;
                  auVar232 = vminps_avx(auVar103,auVar157);
                  auVar158._8_4_ = 0xc2b0c0a5;
                  auVar158._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar158._12_4_ = 0xc2b0c0a5;
                  auVar377 = vmaxps_avx(auVar232,auVar158);
                  auVar379._8_4_ = 0x3fb8aa3b;
                  auVar379._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar379._12_4_ = 0x3fb8aa3b;
                  auVar232 = vfmadd213ps_fma(auVar379,auVar377,auVar400);
                  auVar467._0_4_ = (int)auVar232._0_4_;
                  auVar467._4_4_ = (int)auVar232._4_4_;
                  auVar467._8_4_ = (int)auVar232._8_4_;
                  auVar467._12_4_ = (int)auVar232._12_4_;
                  auVar399 = vcvtdq2ps_avx(auVar467);
                  auVar232 = vcmpps_avx(auVar232,auVar399,1);
                  auVar232 = vandps_avx(auVar232,auVar80);
                  auVar232 = vsubps_avx(auVar399,auVar232);
                  auVar159._8_4_ = 0x3f318000;
                  auVar159._0_8_ = 0x3f3180003f318000;
                  auVar159._12_4_ = 0x3f318000;
                  auVar399 = vfmsub231ps_fma(auVar377,auVar232,auVar159);
                  auVar160._8_4_ = 0x395e8083;
                  auVar160._0_8_ = 0x395e8083395e8083;
                  auVar160._12_4_ = 0x395e8083;
                  auVar377 = vfmsub231ps_fma(auVar399,auVar232,auVar160);
                  auVar468._0_4_ = auVar377._0_4_ * auVar377._0_4_;
                  auVar468._4_4_ = auVar377._4_4_ * auVar377._4_4_;
                  auVar468._8_4_ = auVar377._8_4_ * auVar377._8_4_;
                  auVar468._12_4_ = auVar377._12_4_ * auVar377._12_4_;
                  auVar405._8_4_ = 0x39506967;
                  auVar405._0_8_ = 0x3950696739506967;
                  auVar405._12_4_ = 0x39506967;
                  auVar161._8_4_ = 0x3ab743ce;
                  auVar161._0_8_ = 0x3ab743ce3ab743ce;
                  auVar161._12_4_ = 0x3ab743ce;
                  auVar399 = vfmadd213ps_fma(auVar405,auVar377,auVar161);
                  auVar162._8_4_ = 0x3c088908;
                  auVar162._0_8_ = 0x3c0889083c088908;
                  auVar162._12_4_ = 0x3c088908;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar377,auVar162);
                  auVar163._8_4_ = 0x3d2aa9c1;
                  auVar163._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar163._12_4_ = 0x3d2aa9c1;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar377,auVar163);
                  auVar164._8_4_ = 0x3e2aaaaa;
                  auVar164._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar164._12_4_ = 0x3e2aaaaa;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar377,auVar164);
                  auVar400 = vfmadd213ps_fma(auVar399,auVar377,auVar400);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar468,auVar377);
                  auVar104._0_4_ = auVar400._0_4_ + 1.0;
                  auVar104._4_4_ = auVar400._4_4_ + 1.0;
                  auVar104._8_4_ = auVar400._8_4_ + 1.0;
                  auVar104._12_4_ = auVar400._12_4_ + 1.0;
                  auVar380._0_4_ = (int)auVar232._0_4_;
                  auVar380._4_4_ = (int)auVar232._4_4_;
                  auVar380._8_4_ = (int)auVar232._8_4_;
                  auVar380._12_4_ = (int)auVar232._12_4_;
                  auVar232 = vpslld_avx(auVar380,0x17);
                  auVar232 = vpaddd_avx(auVar232,auVar80);
                  auVar232 = vfmadd213ps_fma(auVar232,auVar104,auVar80);
                  auVar106 = vdivps_avx(auVar80,auVar232);
                  break;
                case 5:
                  auVar427._8_4_ = 0x42b0c0a5;
                  auVar427._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar427._12_4_ = 0x42b0c0a5;
                  auVar399 = vminps_avx(auVar232,auVar427);
                  auVar448._8_4_ = 0xc2b0c0a5;
                  auVar448._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar448._12_4_ = 0xc2b0c0a5;
                  auVar383 = vmaxps_avx(auVar448,auVar399);
                  auVar455._8_4_ = 0x3fb8aa3b;
                  auVar455._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar455._12_4_ = 0x3fb8aa3b;
                  auVar399 = vfmadd213ps_fma(auVar455,auVar383,auVar400);
                  auVar402._0_4_ = (int)auVar399._0_4_;
                  auVar402._4_4_ = (int)auVar399._4_4_;
                  auVar402._8_4_ = (int)auVar399._8_4_;
                  auVar402._12_4_ = (int)auVar399._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar402);
                  auVar399 = vcmpps_avx(auVar399,auVar377,1);
                  auVar399 = vandps_avx(auVar399,auVar80);
                  auVar399 = vsubps_avx(auVar377,auVar399);
                  auVar428._8_4_ = 0x3f318000;
                  auVar428._0_8_ = 0x3f3180003f318000;
                  auVar428._12_4_ = 0x3f318000;
                  auVar377 = vfmsub231ps_fma(auVar383,auVar399,auVar428);
                  auVar449._8_4_ = 0xb95e8083;
                  auVar449._0_8_ = 0xb95e8083b95e8083;
                  auVar449._12_4_ = 0xb95e8083;
                  auVar383 = vfnmsub231ps_fma(auVar377,auVar399,auVar449);
                  auVar403._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar403._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar403._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar403._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar370._8_4_ = 0x39506967;
                  auVar370._0_8_ = 0x3950696739506967;
                  auVar370._12_4_ = 0x39506967;
                  auVar377 = vfmadd213ps_fma(auVar370,auVar383,auVar461);
                  auVar236._8_4_ = 0x3c088908;
                  auVar236._0_8_ = 0x3c0889083c088908;
                  auVar236._12_4_ = 0x3c088908;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar236);
                  auVar331._8_4_ = 0x3d2aa9c1;
                  auVar331._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar331._12_4_ = 0x3d2aa9c1;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar331);
                  auVar332._8_4_ = 0x3e2aaaaa;
                  auVar332._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar332._12_4_ = 0x3e2aaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar332);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar400);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar403,auVar383);
                  auVar150._0_4_ = auVar377._0_4_ + 1.0;
                  auVar150._4_4_ = auVar377._4_4_ + 1.0;
                  auVar150._8_4_ = auVar377._8_4_ + 1.0;
                  auVar150._12_4_ = auVar377._12_4_ + 1.0;
                  auVar99._0_4_ = (int)auVar399._0_4_;
                  auVar99._4_4_ = (int)auVar399._4_4_;
                  auVar99._8_4_ = (int)auVar399._8_4_;
                  auVar99._12_4_ = (int)auVar399._12_4_;
                  auVar399 = vpslld_avx(auVar99,0x17);
                  auVar399 = vpaddd_avx(auVar399,auVar80);
                  auVar233 = vfmadd213ps_fma(auVar399,auVar150,auVar80);
                  auVar151._8_4_ = 0x800000;
                  auVar151._0_8_ = 0x80000000800000;
                  auVar151._12_4_ = 0x800000;
                  auVar399 = vmaxps_avx(auVar233,auVar151);
                  auVar377 = vpsrld_avx(auVar399,0x17);
                  auVar277._8_4_ = 0xffffff82;
                  auVar277._0_8_ = 0xffffff82ffffff82;
                  auVar277._12_4_ = 0xffffff82;
                  auVar377 = vpaddd_avx(auVar377,auVar277);
                  auVar278._8_4_ = 0x807fffff;
                  auVar278._0_8_ = 0x807fffff807fffff;
                  auVar278._12_4_ = 0x807fffff;
                  auVar399 = vandps_avx(auVar399,auVar278);
                  auVar96 = vorps_avx(auVar399,auVar400);
                  auVar383 = vcvtdq2ps_avx(auVar377);
                  auVar279._8_4_ = 0x3f3504f3;
                  auVar279._0_8_ = 0x3f3504f33f3504f3;
                  auVar279._12_4_ = 0x3f3504f3;
                  auVar377 = vcmpps_avx(auVar96,auVar279,1);
                  auVar399 = vandps_avx(auVar377,auVar96);
                  auVar152._0_4_ = auVar399._0_4_ + auVar96._0_4_ + -1.0;
                  auVar152._4_4_ = auVar399._4_4_ + auVar96._4_4_ + -1.0;
                  auVar152._8_4_ = auVar399._8_4_ + auVar96._8_4_ + -1.0;
                  auVar152._12_4_ = auVar399._12_4_ + auVar96._12_4_ + -1.0;
                  auVar399 = vandps_avx(auVar377,auVar80);
                  auVar377 = vsubps_avx(auVar383,auVar399);
                  auVar394._0_4_ = auVar152._0_4_ * auVar152._0_4_;
                  auVar394._4_4_ = auVar152._4_4_ * auVar152._4_4_;
                  auVar394._8_4_ = auVar152._8_4_ * auVar152._8_4_;
                  auVar394._12_4_ = auVar152._12_4_ * auVar152._12_4_;
                  auVar404._8_4_ = 0x3d9021bb;
                  auVar404._0_8_ = 0x3d9021bb3d9021bb;
                  auVar404._12_4_ = 0x3d9021bb;
                  auVar280._8_4_ = 0xbdebd1b8;
                  auVar280._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar280._12_4_ = 0xbdebd1b8;
                  auVar399 = vfmadd213ps_fma(auVar404,auVar152,auVar280);
                  auVar281._8_4_ = 0x3def251a;
                  auVar281._0_8_ = 0x3def251a3def251a;
                  auVar281._12_4_ = 0x3def251a;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar281);
                  auVar282._8_4_ = 0xbdfe5d4f;
                  auVar282._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar282._12_4_ = 0xbdfe5d4f;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar282);
                  auVar283._8_4_ = 0x3e11e9bf;
                  auVar283._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar283._12_4_ = 0x3e11e9bf;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar283);
                  auVar284._8_4_ = 0xbe2aae50;
                  auVar284._0_8_ = 0xbe2aae50be2aae50;
                  auVar284._12_4_ = 0xbe2aae50;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar284);
                  auVar285._8_4_ = 0x3e4cceac;
                  auVar285._0_8_ = 0x3e4cceac3e4cceac;
                  auVar285._12_4_ = 0x3e4cceac;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar285);
                  auVar286._8_4_ = 0xbe7ffffc;
                  auVar286._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar286._12_4_ = 0xbe7ffffc;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar286);
                  auVar287._8_4_ = 0x3eaaaaaa;
                  auVar287._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar287._12_4_ = 0x3eaaaaaa;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar152,auVar287);
                  auVar288._0_4_ = auVar399._0_4_ * auVar394._0_4_ * auVar152._0_4_;
                  auVar288._4_4_ = auVar399._4_4_ * auVar394._4_4_ * auVar152._4_4_;
                  auVar288._8_4_ = auVar399._8_4_ * auVar394._8_4_ * auVar152._8_4_;
                  auVar288._12_4_ = auVar399._12_4_ * auVar394._12_4_ * auVar152._12_4_;
                  auVar399 = vfmadd231ps_fma(auVar288,auVar377,auVar449);
                  auVar383 = vfmsub231ps_fma(auVar399,auVar400,auVar394);
                  auVar399 = vcmpps_avx(auVar233,_DAT_00536030,2);
                  auVar383 = vsubps_avx(auVar383,auVar152);
                  auVar377 = vfnmadd231ps_fma(auVar383,auVar428,auVar377);
                  auVar153._0_4_ = auVar377._0_4_ + auVar377._0_4_;
                  auVar153._4_4_ = auVar377._4_4_ + auVar377._4_4_;
                  auVar153._8_4_ = auVar377._8_4_ + auVar377._8_4_;
                  auVar153._12_4_ = auVar377._12_4_ + auVar377._12_4_;
                  auVar289._8_4_ = 0x7fffffff;
                  auVar289._0_8_ = 0x7fffffff7fffffff;
                  auVar289._12_4_ = 0x7fffffff;
                  auVar399 = vblendvps_avx(auVar153,auVar289,auVar399);
                  auVar154._8_4_ = 0x42b0c0a5;
                  auVar154._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar154._12_4_ = 0x42b0c0a5;
                  auVar399 = vminps_avx(auVar399,auVar154);
                  auVar155._8_4_ = 0xc2b0c0a5;
                  auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar155._12_4_ = 0xc2b0c0a5;
                  auVar383 = vmaxps_avx(auVar399,auVar155);
                  auVar399 = vfmadd213ps_fma(auVar455,auVar383,auVar400);
                  auVar290._0_4_ = (int)auVar399._0_4_;
                  auVar290._4_4_ = (int)auVar399._4_4_;
                  auVar290._8_4_ = (int)auVar399._8_4_;
                  auVar290._12_4_ = (int)auVar399._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar290);
                  auVar399 = vcmpps_avx(auVar399,auVar377,1);
                  auVar399 = vandps_avx(auVar399,auVar80);
                  auVar399 = vsubps_avx(auVar377,auVar399);
                  auVar377 = vfmsub231ps_fma(auVar383,auVar399,auVar428);
                  auVar383 = vfnmsub231ps_fma(auVar377,auVar399,auVar449);
                  auVar291._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar291._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar291._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar291._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar377 = vfmadd213ps_fma(auVar370,auVar383,auVar461);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar236);
                  auVar95 = ZEXT1664(auVar400);
                  auVar312 = ZEXT864(0);
                  auVar371._8_4_ = 0x3d2aa9c1;
                  auVar371._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar371._12_4_ = 0x3d2aa9c1;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar371);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar332);
                  auVar400 = vfmadd213ps_fma(auVar377,auVar383,auVar400);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar291,auVar383);
                  auVar100._0_4_ = auVar400._0_4_ + 1.0;
                  auVar100._4_4_ = auVar400._4_4_ + 1.0;
                  auVar100._8_4_ = auVar400._8_4_ + 1.0;
                  auVar100._12_4_ = auVar400._12_4_ + 1.0;
                  auVar156._0_4_ = (int)auVar399._0_4_;
                  auVar156._4_4_ = (int)auVar399._4_4_;
                  auVar156._8_4_ = (int)auVar399._8_4_;
                  auVar156._12_4_ = (int)auVar399._12_4_;
                  auVar400 = vpslld_avx(auVar156,0x17);
                  auVar400 = vpaddd_avx(auVar400,auVar80);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar100,auVar80);
                  auVar101._8_4_ = 0x40000000;
                  auVar101._0_8_ = 0x4000000040000000;
                  auVar101._12_4_ = 0x40000000;
                  auVar400 = vdivps_avx(auVar101,auVar400);
                  auVar106 = vfmsub213ps_fma(auVar400,auVar232,auVar232);
                  break;
                case 6:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar105._4_4_ = uVar79;
                  auVar105._0_4_ = uVar79;
                  auVar105._8_4_ = uVar79;
                  auVar105._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar165._4_4_ = uVar79;
                  auVar165._0_4_ = uVar79;
                  auVar165._8_4_ = uVar79;
                  auVar165._12_4_ = uVar79;
                  auVar232 = vfmadd231ps_fma(auVar165,auVar232,auVar105);
                  auVar232 = vmaxps_avx(auVar232,auVar399);
                  auVar232 = vminps_avx(auVar232,auVar80);
                  auVar106._0_4_ = auVar369._0_4_ * auVar232._0_4_;
                  auVar106._4_4_ = auVar369._4_4_ * auVar232._4_4_;
                  auVar106._8_4_ = auVar369._8_4_ * auVar232._8_4_;
                  auVar106._12_4_ = auVar369._12_4_ * auVar232._12_4_;
                }
                auVar232 = auVar106;
              }
              *local_1e8 = auVar232;
              local_1e8 = local_1e8 + 1;
              iVar55 = iVar55 + 1;
            }
          }
        }
      }
      if ((iVar70 == 1) && (uVar50 == 8)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar71 = 0;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar65 = 0;
        if (0 < (int)uVar7) {
          uVar65 = (ulong)uVar7;
        }
        uVar67 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar67 = uVar71;
        }
        auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar454 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar312 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar460 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar369 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar145 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar466 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar146 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar465 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        for (; uVar71 != uVar67; uVar71 = uVar71 + 1) {
          local_240 = (undefined1 (*) [32])
                      (local_198.cstep * uVar71 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar72 = 0;
          uVar41 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar41 = uVar72;
          }
          uVar36 = local_198.w;
          if (local_198.w < 1) {
            uVar36 = 0;
          }
          uVar46 = local_198.h;
          if (local_198.h < 1) {
            uVar46 = 0;
          }
          while (uVar69 = (uint)uVar72, uVar69 != uVar46) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar37 = 0; uVar37 != uVar36; uVar37 = uVar37 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar147 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar147 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar11 + uVar71 * 0x20));
              }
              pvVar75 = (void *)((this->weight_data_tm).cstep * uVar71 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar72 = 0; uVar72 != uVar41; uVar72 = uVar72 + 1) {
                pvVar62 = pvVar75;
                for (uVar73 = 0; uVar73 != uVar65; uVar73 = uVar73 + 1) {
                  iVar34 = (((int)uVar73 - uVar7) + 1) * iVar48 + uVar69;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    iVar34 = iVar55;
                    for (lVar43 = 0; uVar54 * 0x20 != lVar43; lVar43 = lVar43 + 0x20) {
                      if (((-1 < iVar34) && (iVar38 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar38 < iVar68)) {
                        uVar79 = *(undefined4 *)
                                  ((long)bottom_blob->data +
                                  (long)iVar38 * 4 +
                                  (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                                  bottom_blob->cstep * bottom_blob->elemsize * uVar72);
                        auVar220._4_4_ = uVar79;
                        auVar220._0_4_ = uVar79;
                        auVar220._8_4_ = uVar79;
                        auVar220._12_4_ = uVar79;
                        auVar220._16_4_ = uVar79;
                        auVar220._20_4_ = uVar79;
                        auVar220._24_4_ = uVar79;
                        auVar220._28_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar147._0_32_,auVar220,
                                                   *(undefined1 (*) [32])((long)pvVar62 + lVar43));
                        auVar147 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  pvVar62 = (void *)((long)pvVar62 + (long)(int)uVar39 * 0x20);
                }
                pvVar75 = (void *)((long)pvVar75 + (long)(int)(uVar39 * uVar7 * 8) * 4);
              }
              auVar138 = auVar147._0_32_;
              auVar463 = auVar138;
              if (5 < iVar49 - 1U) goto switchD_00272a4c_caseD_1;
              auVar89 = auVar95._0_32_;
              auVar463 = vmaxps_avx(auVar138,auVar89);
              auVar415 = auVar369._0_32_;
              auVar87 = auVar312._0_32_;
              auVar433 = auVar145._0_32_;
              auVar473 = auVar454._0_32_;
              auVar208 = auVar460._0_32_;
              auVar457 = auVar146._0_32_;
              auVar253 = auVar466._0_32_;
              auVar451 = auVar465._0_32_;
              switch(iVar49) {
              case 2:
                auVar138 = vminps_avx(auVar138,auVar89);
                uVar79 = *(this->super_Deconvolution).activation_params.data;
                auVar481._4_4_ = uVar79;
                auVar481._0_4_ = uVar79;
                auVar481._8_4_ = uVar79;
                auVar481._12_4_ = uVar79;
                auVar481._16_4_ = uVar79;
                auVar481._20_4_ = uVar79;
                auVar481._24_4_ = uVar79;
                auVar481._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar463,auVar138,auVar481);
                auVar463 = ZEXT1632(auVar232);
                break;
              case 3:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar226._4_4_ = uVar79;
                auVar226._0_4_ = uVar79;
                auVar226._8_4_ = uVar79;
                auVar226._12_4_ = uVar79;
                auVar226._16_4_ = uVar79;
                auVar226._20_4_ = uVar79;
                auVar226._24_4_ = uVar79;
                auVar226._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar484._4_4_ = uVar79;
                auVar484._0_4_ = uVar79;
                auVar484._8_4_ = uVar79;
                auVar484._12_4_ = uVar79;
                auVar484._16_4_ = uVar79;
                auVar484._20_4_ = uVar79;
                auVar484._24_4_ = uVar79;
                auVar484._28_4_ = uVar79;
                auVar463 = vmaxps_avx(auVar138,auVar226);
                auVar463 = vminps_avx(auVar484,auVar463);
                break;
              case 4:
                auVar141._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
                auVar141._8_4_ = -auVar147._8_4_;
                auVar141._12_4_ = -auVar147._12_4_;
                auVar141._16_4_ = -auVar147._16_4_;
                auVar141._20_4_ = -auVar147._20_4_;
                auVar141._24_4_ = -auVar147._24_4_;
                auVar141._28_4_ = auVar147._28_4_ ^ 0x80000000;
                auVar227._8_4_ = 0x42b0c0a5;
                auVar227._0_8_ = 0x42b0c0a542b0c0a5;
                auVar227._12_4_ = 0x42b0c0a5;
                auVar227._16_4_ = 0x42b0c0a5;
                auVar227._20_4_ = 0x42b0c0a5;
                auVar227._24_4_ = 0x42b0c0a5;
                auVar227._28_4_ = 0x42b0c0a5;
                auVar463 = vminps_avx(auVar141,auVar227);
                auVar138 = vmaxps_avx(auVar473,auVar463);
                auVar232 = vfmadd213ps_fma(auVar208,auVar138,auVar87);
                auVar89 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar89,1);
                auVar463 = vandps_avx(auVar463,auVar415);
                auVar463 = vsubps_avx(auVar89,auVar463);
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar433);
                auVar272._8_4_ = 0x395e8083;
                auVar272._0_8_ = 0x395e8083395e8083;
                auVar272._12_4_ = 0x395e8083;
                auVar272._16_4_ = 0x395e8083;
                auVar272._20_4_ = 0x395e8083;
                auVar272._24_4_ = 0x395e8083;
                auVar272._28_4_ = 0x395e8083;
                auVar400 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar272);
                auVar138 = ZEXT1632(auVar400);
                auVar29._28_4_ = auVar89._28_4_;
                auVar29._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar232 = vfmadd213ps_fma(auVar457,auVar138,auVar253);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar451);
                auVar273._8_4_ = 0x3d2aa9c1;
                auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar273._12_4_ = 0x3d2aa9c1;
                auVar273._16_4_ = 0x3d2aa9c1;
                auVar273._20_4_ = 0x3d2aa9c1;
                auVar273._24_4_ = 0x3d2aa9c1;
                auVar273._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar273);
                auVar274._8_4_ = 0x3e2aaaaa;
                auVar274._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar274._12_4_ = 0x3e2aaaaa;
                auVar274._16_4_ = 0x3e2aaaaa;
                auVar274._20_4_ = 0x3e2aaaaa;
                auVar274._24_4_ = 0x3e2aaaaa;
                auVar274._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar274);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar399 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar29,auVar138);
                auVar107._0_4_ = (int)auVar463._0_4_;
                auVar107._4_4_ = (int)auVar463._4_4_;
                auVar107._8_4_ = (int)auVar463._8_4_;
                auVar107._12_4_ = (int)auVar463._12_4_;
                auVar142._16_4_ = (int)auVar463._16_4_;
                auVar142._0_16_ = auVar107;
                auVar142._20_4_ = (int)auVar463._20_4_;
                auVar142._24_4_ = (int)auVar463._24_4_;
                auVar142._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar107,0x17);
                auVar232 = vpslld_avx(auVar142._16_16_,0x17);
                auVar238._8_4_ = 0x3f800000;
                auVar238._0_8_ = 0x3f8000003f800000;
                auVar238._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar238);
                auVar400 = vpaddd_avx(auVar400,auVar238);
                auVar143._16_16_ = auVar232;
                auVar143._0_16_ = auVar400;
                auVar228._0_4_ = auVar399._0_4_ + auVar369._0_4_;
                auVar228._4_4_ = auVar399._4_4_ + auVar369._4_4_;
                auVar228._8_4_ = auVar399._8_4_ + auVar369._8_4_;
                auVar228._12_4_ = auVar399._12_4_ + auVar369._12_4_;
                auVar228._16_4_ = auVar369._16_4_ + 0.0;
                auVar228._20_4_ = auVar369._20_4_ + 0.0;
                auVar228._24_4_ = auVar369._24_4_ + 0.0;
                auVar228._28_4_ = auVar369._28_4_ + 0.0;
                auVar232 = vfmadd213ps_fma(auVar143,auVar228,auVar415);
                auVar463 = vdivps_avx(auVar415,ZEXT1632(auVar232));
                break;
              case 5:
                auVar445._8_4_ = 0x42b0c0a5;
                auVar445._0_8_ = 0x42b0c0a542b0c0a5;
                auVar445._12_4_ = 0x42b0c0a5;
                auVar445._16_4_ = 0x42b0c0a5;
                auVar445._20_4_ = 0x42b0c0a5;
                auVar445._24_4_ = 0x42b0c0a5;
                auVar445._28_4_ = 0x42b0c0a5;
                auVar463 = vminps_avx(auVar445,auVar138);
                auVar138 = vmaxps_avx(auVar473,auVar463);
                auVar232 = vfmadd213ps_fma(auVar208,auVar138,auVar87);
                auVar89 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar89,1);
                auVar463 = vandps_avx(auVar463,auVar415);
                auVar463 = vsubps_avx(auVar89,auVar463);
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar433);
                auVar90._8_4_ = 0xb95e8083;
                auVar90._0_8_ = 0xb95e8083b95e8083;
                auVar90._12_4_ = 0xb95e8083;
                auVar90._16_4_ = 0xb95e8083;
                auVar90._20_4_ = 0xb95e8083;
                auVar90._24_4_ = 0xb95e8083;
                auVar90._28_4_ = 0xb95e8083;
                auVar400 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar90);
                auVar138 = ZEXT1632(auVar400);
                auVar26._28_4_ = auVar89._28_4_;
                auVar26._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar232 = vfmadd213ps_fma(auVar457,auVar138,auVar253);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar451);
                auVar357._8_4_ = 0x3d2aa9c1;
                auVar357._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar357._12_4_ = 0x3d2aa9c1;
                auVar357._16_4_ = 0x3d2aa9c1;
                auVar357._20_4_ = 0x3d2aa9c1;
                auVar357._24_4_ = 0x3d2aa9c1;
                auVar357._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar357);
                auVar91._8_4_ = 0x3e2aaaaa;
                auVar91._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar91._12_4_ = 0x3e2aaaaa;
                auVar91._16_4_ = 0x3e2aaaaa;
                auVar91._20_4_ = 0x3e2aaaaa;
                auVar91._24_4_ = 0x3e2aaaaa;
                auVar91._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar91);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar26,auVar138);
                auVar221._0_4_ = auVar232._0_4_ + auVar369._0_4_;
                auVar221._4_4_ = auVar232._4_4_ + auVar369._4_4_;
                auVar221._8_4_ = auVar232._8_4_ + auVar369._8_4_;
                auVar221._12_4_ = auVar232._12_4_ + auVar369._12_4_;
                auVar221._16_4_ = auVar369._16_4_ + 0.0;
                auVar221._20_4_ = auVar369._20_4_ + 0.0;
                auVar221._24_4_ = auVar369._24_4_ + 0.0;
                auVar221._28_4_ = auVar369._28_4_ + 0.0;
                auVar237._0_4_ = (int)auVar463._0_4_;
                auVar237._4_4_ = (int)auVar463._4_4_;
                auVar237._8_4_ = (int)auVar463._8_4_;
                auVar237._12_4_ = (int)auVar463._12_4_;
                auVar267._16_4_ = (int)auVar463._16_4_;
                auVar267._0_16_ = auVar237;
                auVar267._20_4_ = (int)auVar463._20_4_;
                auVar267._24_4_ = (int)auVar463._24_4_;
                auVar267._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar237,0x17);
                auVar232 = vpslld_avx(auVar267._16_16_,0x17);
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = 0x3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar81);
                auVar400 = vpaddd_avx(auVar400,auVar81);
                auVar482._16_16_ = auVar232;
                auVar482._0_16_ = auVar400;
                auVar399 = vfmadd213ps_fma(auVar482,auVar221,auVar415);
                auVar92._8_4_ = 0x800000;
                auVar92._0_8_ = 0x80000000800000;
                auVar92._12_4_ = 0x800000;
                auVar92._16_4_ = 0x800000;
                auVar92._20_4_ = 0x800000;
                auVar92._24_4_ = 0x800000;
                auVar92._28_4_ = 0x800000;
                auVar463 = vmaxps_avx(ZEXT1632(auVar399),auVar92);
                auVar400 = vpsrld_avx(auVar463._0_16_,0x17);
                auVar232 = vpsrld_avx(auVar463._16_16_,0x17);
                auVar93._8_4_ = 0x807fffff;
                auVar93._0_8_ = 0x807fffff807fffff;
                auVar93._12_4_ = 0x807fffff;
                auVar93._16_4_ = 0x807fffff;
                auVar93._20_4_ = 0x807fffff;
                auVar93._24_4_ = 0x807fffff;
                auVar93._28_4_ = 0x807fffff;
                auVar463 = vandps_avx(auVar463,auVar93);
                auVar89 = vorps_avx(auVar463,auVar87);
                auVar94._8_4_ = 0x3f3504f3;
                auVar94._0_8_ = 0x3f3504f33f3504f3;
                auVar94._12_4_ = 0x3f3504f3;
                auVar94._16_4_ = 0x3f3504f3;
                auVar94._20_4_ = 0x3f3504f3;
                auVar94._24_4_ = 0x3f3504f3;
                auVar94._28_4_ = 0x3f3504f3;
                auVar138 = vcmpps_avx(auVar94,auVar89,2);
                auVar463 = vandnps_avx(auVar138,auVar89);
                auVar222._0_4_ = auVar463._0_4_ + auVar89._0_4_ + -1.0;
                auVar222._4_4_ = auVar463._4_4_ + auVar89._4_4_ + -1.0;
                auVar222._8_4_ = auVar463._8_4_ + auVar89._8_4_ + -1.0;
                auVar222._12_4_ = auVar463._12_4_ + auVar89._12_4_ + -1.0;
                auVar222._16_4_ = auVar463._16_4_ + auVar89._16_4_ + -1.0;
                auVar222._20_4_ = auVar463._20_4_ + auVar89._20_4_ + -1.0;
                auVar222._24_4_ = auVar463._24_4_ + auVar89._24_4_ + -1.0;
                auVar222._28_4_ = auVar463._28_4_ + auVar89._28_4_ + -1.0;
                auVar232 = vpsubd_avx(auVar232,auVar138._16_16_);
                auVar429._8_4_ = 0xffffff81;
                auVar429._0_8_ = 0xffffff81ffffff81;
                auVar429._12_4_ = 0xffffff81;
                auVar232 = vpaddd_avx(auVar232,auVar429);
                auVar400 = vpsubd_avx(auVar400,auVar138._0_16_);
                auVar400 = vpaddd_avx(auVar429,auVar400);
                auVar268._16_16_ = auVar232;
                auVar268._0_16_ = auVar400;
                auVar27._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                auVar27._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                auVar27._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                auVar27._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                auVar27._16_4_ = auVar222._16_4_ * auVar222._16_4_;
                auVar27._20_4_ = auVar222._20_4_ * auVar222._20_4_;
                auVar27._24_4_ = auVar222._24_4_ * auVar222._24_4_;
                auVar27._28_4_ = auVar138._28_4_;
                auVar423._8_4_ = 0x3d9021bb;
                auVar423._0_8_ = 0x3d9021bb3d9021bb;
                auVar423._12_4_ = 0x3d9021bb;
                auVar423._16_4_ = 0x3d9021bb;
                auVar423._20_4_ = 0x3d9021bb;
                auVar423._24_4_ = 0x3d9021bb;
                auVar423._28_4_ = 0x3d9021bb;
                auVar358._8_4_ = 0xbdebd1b8;
                auVar358._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar358._12_4_ = 0xbdebd1b8;
                auVar358._16_4_ = 0xbdebd1b8;
                auVar358._20_4_ = 0xbdebd1b8;
                auVar358._24_4_ = 0xbdebd1b8;
                auVar358._28_4_ = 0xbdebd1b8;
                auVar232 = vfmadd213ps_fma(auVar423,auVar222,auVar358);
                auVar359._8_4_ = 0x3def251a;
                auVar359._0_8_ = 0x3def251a3def251a;
                auVar359._12_4_ = 0x3def251a;
                auVar359._16_4_ = 0x3def251a;
                auVar359._20_4_ = 0x3def251a;
                auVar359._24_4_ = 0x3def251a;
                auVar359._28_4_ = 0x3def251a;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar359);
                auVar360._8_4_ = 0xbdfe5d4f;
                auVar360._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar360._12_4_ = 0xbdfe5d4f;
                auVar360._16_4_ = 0xbdfe5d4f;
                auVar360._20_4_ = 0xbdfe5d4f;
                auVar360._24_4_ = 0xbdfe5d4f;
                auVar360._28_4_ = 0xbdfe5d4f;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar360);
                auVar361._8_4_ = 0x3e11e9bf;
                auVar361._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar361._12_4_ = 0x3e11e9bf;
                auVar361._16_4_ = 0x3e11e9bf;
                auVar361._20_4_ = 0x3e11e9bf;
                auVar361._24_4_ = 0x3e11e9bf;
                auVar361._28_4_ = 0x3e11e9bf;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar361);
                auVar362._8_4_ = 0xbe2aae50;
                auVar362._0_8_ = 0xbe2aae50be2aae50;
                auVar362._12_4_ = 0xbe2aae50;
                auVar362._16_4_ = 0xbe2aae50;
                auVar362._20_4_ = 0xbe2aae50;
                auVar362._24_4_ = 0xbe2aae50;
                auVar362._28_4_ = 0xbe2aae50;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar362);
                auVar363._8_4_ = 0x3e4cceac;
                auVar363._0_8_ = 0x3e4cceac3e4cceac;
                auVar363._12_4_ = 0x3e4cceac;
                auVar363._16_4_ = 0x3e4cceac;
                auVar363._20_4_ = 0x3e4cceac;
                auVar363._24_4_ = 0x3e4cceac;
                auVar363._28_4_ = 0x3e4cceac;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar363);
                auVar364._8_4_ = 0xbe7ffffc;
                auVar364._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar364._12_4_ = 0xbe7ffffc;
                auVar364._16_4_ = 0xbe7ffffc;
                auVar364._20_4_ = 0xbe7ffffc;
                auVar364._24_4_ = 0xbe7ffffc;
                auVar364._28_4_ = 0xbe7ffffc;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar364);
                auVar365._8_4_ = 0x3eaaaaaa;
                auVar365._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar365._12_4_ = 0x3eaaaaaa;
                auVar365._16_4_ = 0x3eaaaaaa;
                auVar365._20_4_ = 0x3eaaaaaa;
                auVar365._24_4_ = 0x3eaaaaaa;
                auVar365._28_4_ = 0x3eaaaaaa;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar222,auVar365);
                auVar424._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar222._0_4_ * auVar232._0_4_;
                auVar424._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar222._4_4_ * auVar232._4_4_;
                auVar424._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar222._8_4_ * auVar232._8_4_;
                auVar424._12_4_ =
                     auVar222._12_4_ * auVar222._12_4_ * auVar222._12_4_ * auVar232._12_4_;
                auVar424._16_4_ = auVar222._16_4_ * auVar222._16_4_ * auVar222._16_4_ * 0.0;
                auVar424._20_4_ = auVar222._20_4_ * auVar222._20_4_ * auVar222._20_4_ * 0.0;
                auVar424._24_4_ = auVar222._24_4_ * auVar222._24_4_ * auVar222._24_4_ * 0.0;
                auVar424._28_4_ = 0;
                auVar454 = ZEXT3264(auVar473);
                auVar460 = ZEXT3264(auVar208);
                auVar466 = ZEXT3264(auVar253);
                auVar146 = ZEXT3264(auVar457);
                auVar145 = ZEXT3264(auVar433);
                auVar465 = ZEXT3264(auVar451);
                auVar312 = ZEXT3264(auVar87);
                auVar95 = ZEXT864(0) << 0x20;
                auVar138 = vcvtdq2ps_avx(auVar268);
                auVar446._8_4_ = 0xb95e8083;
                auVar446._0_8_ = 0xb95e8083b95e8083;
                auVar446._12_4_ = 0xb95e8083;
                auVar446._16_4_ = 0xb95e8083;
                auVar446._20_4_ = 0xb95e8083;
                auVar446._24_4_ = 0xb95e8083;
                auVar446._28_4_ = 0xb95e8083;
                auVar232 = vfmadd231ps_fma(auVar424,auVar138,auVar446);
                auVar232 = vfmsub231ps_fma(ZEXT1632(auVar232),auVar87,auVar27);
                auVar463 = vcmpps_avx(ZEXT1632(auVar399),ZEXT832(0) << 0x20,2);
                auVar89 = vsubps_avx(ZEXT1632(auVar232),auVar222);
                auVar232 = vfmsub231ps_fma(auVar89,auVar433,auVar138);
                auVar483._8_4_ = 0xc0000000;
                auVar483._0_8_ = 0xc0000000c0000000;
                auVar483._12_4_ = 0xc0000000;
                auVar483._16_4_ = 0xc0000000;
                auVar483._20_4_ = 0xc0000000;
                auVar483._24_4_ = 0xc0000000;
                auVar483._28_4_ = 0xc0000000;
                auVar223._0_4_ = auVar232._0_4_ * -2.0;
                auVar223._4_4_ = auVar232._4_4_ * -2.0;
                auVar223._8_4_ = auVar232._8_4_ * -2.0;
                auVar223._12_4_ = auVar232._12_4_ * -2.0;
                auVar223._16_4_ = 0x80000000;
                auVar223._20_4_ = 0x80000000;
                auVar223._24_4_ = 0x80000000;
                auVar223._28_4_ = 0;
                auVar269._8_4_ = 0x7fffffff;
                auVar269._0_8_ = 0x7fffffff7fffffff;
                auVar269._12_4_ = 0x7fffffff;
                auVar269._16_4_ = 0x7fffffff;
                auVar269._20_4_ = 0x7fffffff;
                auVar269._24_4_ = 0x7fffffff;
                auVar269._28_4_ = 0x7fffffff;
                auVar463 = vblendvps_avx(auVar223,auVar269,auVar463);
                auVar463 = vminps_avx(auVar463,auVar445);
                auVar138 = vmaxps_avx(auVar473,auVar463);
                auVar232 = vfmadd213ps_fma(auVar208,auVar138,auVar87);
                auVar89 = vroundps_avx(ZEXT1632(auVar232),1);
                auVar463 = vcmpps_avx(ZEXT1632(auVar232),auVar89,1);
                auVar366._8_4_ = 0x3f800000;
                auVar366._0_8_ = 0x3f8000003f800000;
                auVar366._12_4_ = 0x3f800000;
                auVar366._16_4_ = 0x3f800000;
                auVar366._20_4_ = 0x3f800000;
                auVar366._24_4_ = 0x3f800000;
                auVar366._28_4_ = 0x3f800000;
                auVar463 = vandps_avx(auVar463,auVar366);
                auVar463 = vsubps_avx(auVar89,auVar463);
                auVar232 = vfmsub231ps_fma(auVar138,auVar463,auVar433);
                auVar400 = vfnmsub231ps_fma(ZEXT1632(auVar232),auVar463,auVar446);
                auVar138 = ZEXT1632(auVar400);
                auVar28._28_4_ = auVar89._28_4_;
                auVar28._0_28_ =
                     ZEXT1628(CONCAT412(auVar400._12_4_ * auVar400._12_4_,
                                        CONCAT48(auVar400._8_4_ * auVar400._8_4_,
                                                 CONCAT44(auVar400._4_4_ * auVar400._4_4_,
                                                          auVar400._0_4_ * auVar400._0_4_))));
                auVar232 = vfmadd213ps_fma(auVar457,auVar138,auVar253);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar451);
                auVar367._8_4_ = 0x3d2aa9c1;
                auVar367._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar367._12_4_ = 0x3d2aa9c1;
                auVar367._16_4_ = 0x3d2aa9c1;
                auVar367._20_4_ = 0x3d2aa9c1;
                auVar367._24_4_ = 0x3d2aa9c1;
                auVar367._28_4_ = 0x3d2aa9c1;
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar367);
                auVar368._8_4_ = 0x3e2aaaaa;
                auVar368._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar368._12_4_ = 0x3e2aaaaa;
                auVar368._16_4_ = 0x3e2aaaaa;
                auVar368._20_4_ = 0x3e2aaaaa;
                auVar368._24_4_ = 0x3e2aaaaa;
                auVar368._28_4_ = 0x3e2aaaaa;
                auVar138 = ZEXT1632(auVar400);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar368);
                auVar232 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar138,auVar87);
                auVar399 = vfmadd213ps_fma(ZEXT1632(auVar232),auVar28,auVar138);
                auVar330._8_4_ = 0x3f800000;
                auVar330._0_8_ = 0x3f8000003f800000;
                auVar330._12_4_ = 0x3f800000;
                auVar330._16_4_ = 0x3f800000;
                auVar330._20_4_ = 0x3f800000;
                auVar330._24_4_ = 0x3f800000;
                auVar330._28_4_ = 0x3f800000;
                auVar369 = ZEXT3264(auVar330);
                auVar166._0_4_ = (int)auVar463._0_4_;
                auVar166._4_4_ = (int)auVar463._4_4_;
                auVar166._8_4_ = (int)auVar463._8_4_;
                auVar166._12_4_ = (int)auVar463._12_4_;
                auVar224._16_4_ = (int)auVar463._16_4_;
                auVar224._0_16_ = auVar166;
                auVar224._20_4_ = (int)auVar463._20_4_;
                auVar224._24_4_ = (int)auVar463._24_4_;
                auVar224._28_4_ = (int)auVar463._28_4_;
                auVar400 = vpslld_avx(auVar166,0x17);
                auVar232 = vpslld_avx(auVar224._16_16_,0x17);
                auVar333._8_4_ = 0x3f800000;
                auVar333._0_8_ = 0x3f8000003f800000;
                auVar333._12_4_ = 0x3f800000;
                auVar232 = vpaddd_avx(auVar232,auVar333);
                auVar400 = vpaddd_avx(auVar400,auVar333);
                auVar225._16_16_ = auVar232;
                auVar225._0_16_ = auVar400;
                auVar270._0_4_ = auVar399._0_4_ + 1.0;
                auVar270._4_4_ = auVar399._4_4_ + 1.0;
                auVar270._8_4_ = auVar399._8_4_ + 1.0;
                auVar270._12_4_ = auVar399._12_4_ + 1.0;
                auVar270._16_4_ = 0x3f800000;
                auVar270._20_4_ = 0x3f800000;
                auVar270._24_4_ = 0x3f800000;
                auVar270._28_4_ = 0x3f800000;
                auVar232 = vfmadd213ps_fma(auVar225,auVar270,auVar330);
                auVar463 = vdivps_avx(auVar330,ZEXT1632(auVar232));
                auVar271._8_4_ = 0xbf800000;
                auVar271._0_8_ = 0xbf800000bf800000;
                auVar271._12_4_ = 0xbf800000;
                auVar271._16_4_ = 0xbf800000;
                auVar271._20_4_ = 0xbf800000;
                auVar271._24_4_ = 0xbf800000;
                auVar271._28_4_ = 0xbf800000;
                auVar232 = vfnmadd213ps_fma(auVar463,auVar483,auVar271);
                auVar485 = ZEXT1664(auVar232);
                goto LAB_00272e69;
              case 6:
                puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar79 = *puVar9;
                auVar229._4_4_ = uVar79;
                auVar229._0_4_ = uVar79;
                auVar229._8_4_ = uVar79;
                auVar229._12_4_ = uVar79;
                auVar229._16_4_ = uVar79;
                auVar229._20_4_ = uVar79;
                auVar229._24_4_ = uVar79;
                auVar229._28_4_ = uVar79;
                uVar79 = puVar9[1];
                auVar275._4_4_ = uVar79;
                auVar275._0_4_ = uVar79;
                auVar275._8_4_ = uVar79;
                auVar275._12_4_ = uVar79;
                auVar275._16_4_ = uVar79;
                auVar275._20_4_ = uVar79;
                auVar275._24_4_ = uVar79;
                auVar275._28_4_ = uVar79;
                auVar232 = vfmadd231ps_fma(auVar275,auVar138,auVar229);
                auVar463 = vmaxps_avx(ZEXT1632(auVar232),auVar89);
                auVar463 = vminps_avx(auVar463,auVar415);
                auVar485 = ZEXT3264(auVar463);
LAB_00272e69:
                auVar230._0_4_ = auVar485._0_4_ * auVar147._0_4_;
                auVar230._4_4_ = auVar485._4_4_ * auVar147._4_4_;
                auVar230._8_4_ = auVar485._8_4_ * auVar147._8_4_;
                auVar230._12_4_ = auVar485._12_4_ * auVar147._12_4_;
                auVar230._16_4_ = auVar485._16_4_ * auVar147._16_4_;
                auVar230._20_4_ = auVar485._20_4_ * auVar147._20_4_;
                auVar230._28_36_ = auVar485._28_36_;
                auVar230._24_4_ = auVar485._24_4_ * auVar147._24_4_;
                auVar463 = auVar230._0_32_;
              }
switchD_00272a4c_caseD_1:
              *local_240 = auVar463;
              local_240 = local_240 + 1;
              iVar55 = iVar55 + 1;
            }
            uVar72 = (ulong)(uVar69 + 1);
          }
        }
      }
      if ((iVar70 == 8) && (uVar50 == 1)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).activation_type;
        local_120 = local_198.elemsize * local_198.cstep;
        uVar71 = 0;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar65 = 0;
        if (0 < (int)uVar7) {
          uVar65 = (ulong)uVar7;
        }
        uVar67 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar67 = uVar71;
        }
        uVar36 = local_198.w;
        if (local_198.w < 1) {
          uVar36 = 0;
        }
        uVar46 = local_198.h;
        if (local_198.h < 1) {
          uVar46 = 0;
        }
        local_138 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          local_138 = uVar71;
        }
        iVar47 = (this->super_Deconvolution).stride_w;
        iVar49 = (this->super_Deconvolution).stride_h;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        local_128 = local_198.data;
        iVar68 = bottom_blob->w;
        iVar6 = bottom_blob->h;
        for (; uVar71 != local_138; uVar71 = uVar71 + 1) {
          local_240 = (undefined1 (*) [32])(local_120 * uVar71 + (long)local_128);
          for (uVar69 = 0; uVar69 != uVar46; uVar69 = uVar69 + 1) {
            pfVar57 = (float *)(this->super_Deconvolution).activation_params.data;
            sVar12 = (this->weight_data_tm).cstep;
            sVar10 = (this->weight_data_tm).elemsize;
            pvVar75 = (this->weight_data_tm).data;
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar37 = 0; uVar37 != uVar36; uVar37 = uVar37 + 1) {
              if (pvVar11 == (void *)0x0) {
                fVar78 = 0.0;
              }
              else {
                fVar78 = *(float *)((long)pvVar11 + uVar71 * 4);
              }
              auVar95 = ZEXT1664((undefined1  [16])0x0);
              pvVar62 = (void *)(sVar12 * uVar71 * sVar10 + (long)pvVar75);
              for (uVar41 = 0; uVar41 != uVar67; uVar41 = uVar41 + 1) {
                pvVar58 = pvVar62;
                for (uVar72 = 0; uVar72 != uVar65; uVar72 = uVar72 + 1) {
                  iVar34 = (((int)uVar72 - uVar7) + 1) * iVar48 + uVar69;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar49, iVar34 % iVar49 == 0)) &&
                     (iVar51 < iVar6)) {
                    iVar34 = iVar55;
                    for (lVar43 = 0; uVar54 * 0x20 != lVar43; lVar43 = lVar43 + 0x20) {
                      if (((-1 < iVar34) && (iVar38 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                         (iVar38 < iVar68)) {
                        auVar232 = vfmadd231ps_fma(auVar95._0_32_,
                                                   *(undefined1 (*) [32])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar38 << 3) * 4 +
                                                    (long)iVar51 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar41),*(undefined1 (*) [32])
                                                             ((long)pvVar58 + lVar43));
                        auVar95 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  pvVar58 = (void *)((long)pvVar58 + (long)(int)uVar39 * 0x20);
                }
                pvVar62 = (void *)((long)pvVar62 + (long)(int)(uVar39 * uVar7 * 8) * 4);
              }
              auVar108._0_4_ = auVar95._16_4_ + auVar95._0_4_;
              auVar108._4_4_ = auVar95._20_4_ + auVar95._4_4_;
              auVar108._8_4_ = auVar95._24_4_ + auVar95._8_4_;
              auVar108._12_4_ = auVar95._28_4_ + auVar95._12_4_;
              auVar232 = vshufpd_avx(auVar108,auVar108,1);
              auVar109._0_4_ = auVar232._0_4_ + auVar108._0_4_;
              auVar109._4_4_ = auVar232._4_4_ + auVar108._4_4_;
              auVar109._8_4_ = auVar232._8_4_ + auVar108._8_4_;
              auVar109._12_4_ = auVar232._12_4_ + auVar108._12_4_;
              auVar232 = vmovshdup_avx(auVar109);
              fVar78 = auVar232._0_4_ + fVar78 + auVar109._0_4_;
              auVar232 = ZEXT416((uint)fVar78);
              fVar77 = fVar78;
              if (iVar33 - 1U < 6) {
                switch(iVar33) {
                case 1:
                  auVar232 = vmaxss_avx(ZEXT416((uint)fVar78),ZEXT416(0));
                  fVar77 = auVar232._0_4_;
                  break;
                case 2:
                  auVar82._0_12_ = ZEXT812(0);
                  auVar82._12_4_ = 0;
                  auVar232 = vcmpss_avx(auVar82,ZEXT416((uint)fVar78),1);
                  auVar168._8_4_ = 0x3f800000;
                  auVar168._0_8_ = 0x3f8000003f800000;
                  auVar168._12_4_ = 0x3f800000;
                  auVar232 = vblendvps_avx(ZEXT416((uint)*pfVar57),auVar168,auVar232);
                  fVar77 = auVar232._0_4_ * fVar78;
                  break;
                case 3:
                  auVar232 = vmaxss_avx(auVar232,ZEXT416((uint)*pfVar57));
                  fVar77 = auVar232._0_4_;
                  if (pfVar57[1] < auVar232._0_4_) {
                    fVar77 = pfVar57[1];
                  }
                  break;
                case 4:
                  auVar232 = vminss_avx(auVar232,ZEXT416(0x42b0c0a5));
                  auVar110._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
                  auVar110._8_4_ = auVar232._8_4_ ^ 0x80000000;
                  auVar110._12_4_ = auVar232._12_4_ ^ 0x80000000;
                  auVar232 = vcmpss_avx(auVar232,ZEXT416(0xc2b0c0a5),1);
                  auVar167._8_4_ = 0x42b0c0a5;
                  auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar167._12_4_ = 0x42b0c0a5;
                  auVar232 = vblendvps_avx(auVar110,auVar167,auVar232);
                  fVar78 = expf(auVar232._0_4_);
                  fVar77 = 1.0 / (fVar78 + 1.0);
                  break;
                case 5:
                  fVar77 = expf(fVar78);
                  fVar77 = logf(fVar77 + 1.0);
                  fVar77 = tanhf(fVar77);
                  fVar77 = fVar77 * fVar78;
                  break;
                case 6:
                  fVar1 = *pfVar57;
                  fVar231 = -pfVar57[1] / fVar1;
                  fVar77 = 0.0;
                  if ((fVar231 <= fVar78) && (fVar77 = fVar78, fVar78 <= fVar231 + 1.0 / fVar1)) {
                    auVar232 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar232,
                                               ZEXT416((uint)pfVar57[1]));
                    fVar77 = auVar232._0_4_ * fVar78;
                  }
                }
              }
              *(float *)local_240 = fVar77;
              local_240 = (undefined1 (*) [32])((long)local_240 + 4);
              iVar55 = iVar55 + 1;
            }
          }
        }
      }
      if ((iVar70 == 4) && (uVar50 == 4)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar71 = 0;
        if (0 < (int)uVar7) {
          uVar71 = (ulong)uVar7;
        }
        uVar65 = 0;
        uVar36 = local_198.c;
        if (local_198.c < 1) {
          uVar36 = 0;
        }
        auVar312 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar95 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar450._8_4_ = 0xc2b0c0a5;
        auVar450._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar450._12_4_ = 0xc2b0c0a5;
        auVar462._8_4_ = 0x3ab743ce;
        auVar462._0_8_ = 0x3ab743ce3ab743ce;
        auVar462._12_4_ = 0x3ab743ce;
        auVar239._8_4_ = 0x3c088908;
        auVar239._0_8_ = 0x3c0889083c088908;
        auVar239._12_4_ = 0x3c088908;
        for (; uVar65 != uVar36; uVar65 = uVar65 + 1) {
          local_1e8 = (undefined1 (*) [16])
                      (local_198.cstep * uVar65 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar41 = 0;
          uVar67 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar67 = uVar41;
          }
          uVar46 = local_198.w;
          if (local_198.w < 1) {
            uVar46 = 0;
          }
          uVar69 = local_198.h;
          if (local_198.h < 1) {
            uVar69 = 0;
          }
          while (uVar37 = (uint)uVar41, uVar37 != uVar69) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar35 = 0; uVar35 != uVar46; uVar35 = uVar35 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar232 = ZEXT816(0) << 0x40;
              }
              else {
                auVar232 = *(undefined1 (*) [16])((long)pvVar11 + uVar65 * 0x10);
              }
              auVar369 = ZEXT1664(auVar232);
              pvVar75 = bottom_blob->data;
              lVar43 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar65 * (this->weight_data_tm).elemsize +
                       0x30;
              for (uVar41 = 0; uVar41 != uVar67; uVar41 = uVar41 + 1) {
                lVar53 = lVar43;
                for (uVar72 = 0; uVar72 != uVar71; uVar72 = uVar72 + 1) {
                  iVar34 = (((int)uVar72 - uVar7) + 1) * iVar48 + uVar37;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    lVar45 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar41;
                    iVar34 = iVar55;
                    for (lVar56 = 0; uVar54 * 0x40 != lVar56; lVar56 = lVar56 + 0x40) {
                      if (((-1 < iVar34) && (iVar51 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar51 < iVar68)) {
                        lVar40 = (long)(iVar51 << 2);
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45);
                        auVar111._4_4_ = uVar79;
                        auVar111._0_4_ = uVar79;
                        auVar111._8_4_ = uVar79;
                        auVar111._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 4);
                        auVar169._4_4_ = uVar79;
                        auVar169._0_4_ = uVar79;
                        auVar169._8_4_ = uVar79;
                        auVar169._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 8);
                        auVar292._4_4_ = uVar79;
                        auVar292._0_4_ = uVar79;
                        auVar292._8_4_ = uVar79;
                        auVar292._12_4_ = uVar79;
                        uVar79 = *(undefined4 *)((long)pvVar75 + lVar40 * 4 + lVar45 + 0xc);
                        auVar381._4_4_ = uVar79;
                        auVar381._0_4_ = uVar79;
                        auVar381._8_4_ = uVar79;
                        auVar381._12_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar369._0_16_,auVar111,
                                                   *(undefined1 (*) [16])(lVar53 + -0x30 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar169,
                                                   *(undefined1 (*) [16])(lVar53 + -0x20 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar292,
                                                   *(undefined1 (*) [16])(lVar53 + -0x10 + lVar56));
                        auVar232 = vfmadd231ps_fma(auVar232,auVar381,
                                                   *(undefined1 (*) [16])(lVar53 + lVar56));
                        auVar369 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  lVar53 = lVar53 + (long)(int)uVar39 * 0x40;
                }
                lVar43 = lVar43 + (long)(int)(uVar39 * uVar7 * 0x10) * 4;
              }
              auVar232 = auVar369._0_16_;
              auVar119 = auVar232;
              if (iVar49 - 1U < 6) {
                auVar119 = vmaxps_avx(auVar232,_DAT_00536030);
                auVar400 = auVar95._0_16_;
                auVar399 = auVar312._0_16_;
                switch(iVar49) {
                case 2:
                  auVar232 = vminps_avx(auVar232,_DAT_00536030);
                  uVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar382._4_4_ = uVar79;
                  auVar382._0_4_ = uVar79;
                  auVar382._8_4_ = uVar79;
                  auVar382._12_4_ = uVar79;
                  auVar119 = vfmadd231ps_fma(auVar119,auVar232,auVar382);
                  break;
                case 3:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar115._4_4_ = uVar79;
                  auVar115._0_4_ = uVar79;
                  auVar115._8_4_ = uVar79;
                  auVar115._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar385._4_4_ = uVar79;
                  auVar385._0_4_ = uVar79;
                  auVar385._8_4_ = uVar79;
                  auVar385._12_4_ = uVar79;
                  auVar232 = vmaxps_avx(auVar232,auVar115);
                  auVar119 = vminps_avx(auVar385,auVar232);
                  break;
                case 4:
                  auVar116._0_8_ = auVar369._0_8_ ^ 0x8000000080000000;
                  auVar116._8_4_ = -auVar369._8_4_;
                  auVar116._12_4_ = -auVar369._12_4_;
                  auVar176._8_4_ = 0x42b0c0a5;
                  auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar176._12_4_ = 0x42b0c0a5;
                  auVar232 = vminps_avx(auVar116,auVar176);
                  auVar177._8_4_ = 0xc2b0c0a5;
                  auVar177._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar177._12_4_ = 0xc2b0c0a5;
                  auVar383 = vmaxps_avx(auVar232,auVar177);
                  auVar386._8_4_ = 0x3fb8aa3b;
                  auVar386._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar386._12_4_ = 0x3fb8aa3b;
                  auVar232 = vfmadd213ps_fma(auVar386,auVar383,auVar399);
                  auVar469._0_4_ = (int)auVar232._0_4_;
                  auVar469._4_4_ = (int)auVar232._4_4_;
                  auVar469._8_4_ = (int)auVar232._8_4_;
                  auVar469._12_4_ = (int)auVar232._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar469);
                  auVar232 = vcmpps_avx(auVar232,auVar377,1);
                  auVar232 = vandps_avx(auVar232,auVar400);
                  auVar232 = vsubps_avx(auVar377,auVar232);
                  auVar178._8_4_ = 0x3f318000;
                  auVar178._0_8_ = 0x3f3180003f318000;
                  auVar178._12_4_ = 0x3f318000;
                  auVar377 = vfmsub231ps_fma(auVar383,auVar232,auVar178);
                  auVar179._8_4_ = 0x395e8083;
                  auVar179._0_8_ = 0x395e8083395e8083;
                  auVar179._12_4_ = 0x395e8083;
                  auVar383 = vfmsub231ps_fma(auVar377,auVar232,auVar179);
                  auVar470._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar470._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar470._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar470._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar410._8_4_ = 0x39506967;
                  auVar410._0_8_ = 0x3950696739506967;
                  auVar410._12_4_ = 0x39506967;
                  auVar180._8_4_ = 0x3ab743ce;
                  auVar180._0_8_ = 0x3ab743ce3ab743ce;
                  auVar180._12_4_ = 0x3ab743ce;
                  auVar377 = vfmadd213ps_fma(auVar410,auVar383,auVar180);
                  auVar181._8_4_ = 0x3c088908;
                  auVar181._0_8_ = 0x3c0889083c088908;
                  auVar181._12_4_ = 0x3c088908;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar181);
                  auVar182._8_4_ = 0x3d2aa9c1;
                  auVar182._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar182._12_4_ = 0x3d2aa9c1;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar182);
                  auVar183._8_4_ = 0x3e2aaaaa;
                  auVar183._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar183._12_4_ = 0x3e2aaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar183);
                  auVar399 = vfmadd213ps_fma(auVar377,auVar383,auVar399);
                  auVar399 = vfmadd213ps_fma(auVar399,auVar470,auVar383);
                  auVar117._0_4_ = auVar399._0_4_ + auVar95._0_4_;
                  auVar117._4_4_ = auVar399._4_4_ + auVar95._4_4_;
                  auVar117._8_4_ = auVar399._8_4_ + auVar95._8_4_;
                  auVar117._12_4_ = auVar399._12_4_ + auVar95._12_4_;
                  auVar387._0_4_ = (int)auVar232._0_4_;
                  auVar387._4_4_ = (int)auVar232._4_4_;
                  auVar387._8_4_ = (int)auVar232._8_4_;
                  auVar387._12_4_ = (int)auVar232._12_4_;
                  auVar232 = vpslld_avx(auVar387,0x17);
                  auVar232 = vpaddd_avx(auVar232,auVar400);
                  auVar232 = vfmadd213ps_fma(auVar232,auVar117,auVar400);
                  auVar119 = vdivps_avx(auVar400,auVar232);
                  break;
                case 5:
                  auVar430._8_4_ = 0x42b0c0a5;
                  auVar430._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar430._12_4_ = 0x42b0c0a5;
                  auVar377 = vminps_avx(auVar232,auVar430);
                  auVar96 = vmaxps_avx(auVar450,auVar377);
                  auVar456._8_4_ = 0x3fb8aa3b;
                  auVar456._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar456._12_4_ = 0x3fb8aa3b;
                  auVar377 = vfmadd213ps_fma(auVar456,auVar96,auVar399);
                  auVar406._0_4_ = (int)auVar377._0_4_;
                  auVar406._4_4_ = (int)auVar377._4_4_;
                  auVar406._8_4_ = (int)auVar377._8_4_;
                  auVar406._12_4_ = (int)auVar377._12_4_;
                  auVar383 = vcvtdq2ps_avx(auVar406);
                  auVar377 = vcmpps_avx(auVar377,auVar383,1);
                  auVar377 = vandps_avx(auVar377,auVar400);
                  auVar377 = vsubps_avx(auVar383,auVar377);
                  auVar83._8_4_ = 0x3f318000;
                  auVar83._0_8_ = 0x3f3180003f318000;
                  auVar83._12_4_ = 0x3f318000;
                  auVar383 = vfmsub231ps_fma(auVar96,auVar377,auVar83);
                  auVar170._8_4_ = 0xb95e8083;
                  auVar170._0_8_ = 0xb95e8083b95e8083;
                  auVar170._12_4_ = 0xb95e8083;
                  auVar96 = vfnmsub231ps_fma(auVar383,auVar377,auVar170);
                  auVar407._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                  auVar407._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                  auVar407._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                  auVar407._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                  auVar431._8_4_ = 0x39506967;
                  auVar431._0_8_ = 0x3950696739506967;
                  auVar431._12_4_ = 0x39506967;
                  auVar383 = vfmadd213ps_fma(auVar431,auVar96,auVar462);
                  auVar383 = vfmadd213ps_fma(auVar383,auVar96,auVar239);
                  auVar334._8_4_ = 0x3d2aa9c1;
                  auVar334._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar334._12_4_ = 0x3d2aa9c1;
                  auVar383 = vfmadd213ps_fma(auVar383,auVar96,auVar334);
                  auVar293._8_4_ = 0x3e2aaaaa;
                  auVar293._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar293._12_4_ = 0x3e2aaaaa;
                  auVar383 = vfmadd213ps_fma(auVar383,auVar96,auVar293);
                  auVar383 = vfmadd213ps_fma(auVar383,auVar96,auVar399);
                  auVar383 = vfmadd213ps_fma(auVar383,auVar407,auVar96);
                  auVar171._0_4_ = auVar383._0_4_ + auVar95._0_4_;
                  auVar171._4_4_ = auVar383._4_4_ + auVar95._4_4_;
                  auVar171._8_4_ = auVar383._8_4_ + auVar95._8_4_;
                  auVar171._12_4_ = auVar383._12_4_ + auVar95._12_4_;
                  auVar112._0_4_ = (int)auVar377._0_4_;
                  auVar112._4_4_ = (int)auVar377._4_4_;
                  auVar112._8_4_ = (int)auVar377._8_4_;
                  auVar112._12_4_ = (int)auVar377._12_4_;
                  auVar377 = vpslld_avx(auVar112,0x17);
                  auVar377 = vpaddd_avx(auVar377,auVar400);
                  auVar148 = vfmadd213ps_fma(auVar377,auVar171,auVar400);
                  auVar172._8_4_ = 0x800000;
                  auVar172._0_8_ = 0x80000000800000;
                  auVar172._12_4_ = 0x800000;
                  auVar377 = vmaxps_avx(auVar148,auVar172);
                  auVar383 = vpsrld_avx(auVar377,0x17);
                  auVar294._8_4_ = 0xffffff82;
                  auVar294._0_8_ = 0xffffff82ffffff82;
                  auVar294._12_4_ = 0xffffff82;
                  auVar383 = vpaddd_avx(auVar383,auVar294);
                  auVar295._8_4_ = 0x807fffff;
                  auVar295._0_8_ = 0x807fffff807fffff;
                  auVar295._12_4_ = 0x807fffff;
                  auVar377 = vandps_avx(auVar377,auVar295);
                  auVar233 = vorps_avx(auVar377,auVar399);
                  auVar96 = vcvtdq2ps_avx(auVar383);
                  auVar296._8_4_ = 0x3f3504f3;
                  auVar296._0_8_ = 0x3f3504f33f3504f3;
                  auVar296._12_4_ = 0x3f3504f3;
                  auVar383 = vcmpps_avx(auVar233,auVar296,1);
                  auVar377 = vandps_avx(auVar383,auVar233);
                  auVar173._0_4_ = auVar233._0_4_ + -1.0 + auVar377._0_4_;
                  auVar173._4_4_ = auVar233._4_4_ + -1.0 + auVar377._4_4_;
                  auVar173._8_4_ = auVar233._8_4_ + -1.0 + auVar377._8_4_;
                  auVar173._12_4_ = auVar233._12_4_ + -1.0 + auVar377._12_4_;
                  auVar400 = vandps_avx(auVar383,auVar400);
                  auVar377 = vsubps_avx(auVar96,auVar400);
                  auVar384._0_4_ = auVar173._0_4_ * auVar173._0_4_;
                  auVar384._4_4_ = auVar173._4_4_ * auVar173._4_4_;
                  auVar384._8_4_ = auVar173._8_4_ * auVar173._8_4_;
                  auVar384._12_4_ = auVar173._12_4_ * auVar173._12_4_;
                  auVar408._8_4_ = 0x3d9021bb;
                  auVar408._0_8_ = 0x3d9021bb3d9021bb;
                  auVar408._12_4_ = 0x3d9021bb;
                  auVar314._8_4_ = 0xbdebd1b8;
                  auVar314._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar314._12_4_ = 0xbdebd1b8;
                  auVar400 = vfmadd213ps_fma(auVar408,auVar173,auVar314);
                  auVar315._8_4_ = 0x3def251a;
                  auVar315._0_8_ = 0x3def251a3def251a;
                  auVar315._12_4_ = 0x3def251a;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar315);
                  auVar316._8_4_ = 0xbdfe5d4f;
                  auVar316._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar316._12_4_ = 0xbdfe5d4f;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar316);
                  auVar317._8_4_ = 0x3e11e9bf;
                  auVar317._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar317._12_4_ = 0x3e11e9bf;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar317);
                  auVar318._8_4_ = 0xbe2aae50;
                  auVar318._0_8_ = 0xbe2aae50be2aae50;
                  auVar318._12_4_ = 0xbe2aae50;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar318);
                  auVar319._8_4_ = 0x3e4cceac;
                  auVar319._0_8_ = 0x3e4cceac3e4cceac;
                  auVar319._12_4_ = 0x3e4cceac;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar319);
                  auVar320._8_4_ = 0xbe7ffffc;
                  auVar320._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar320._12_4_ = 0xbe7ffffc;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar320);
                  auVar321._8_4_ = 0x3eaaaaaa;
                  auVar321._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar321._12_4_ = 0x3eaaaaaa;
                  auVar400 = vfmadd213ps_fma(auVar400,auVar173,auVar321);
                  auVar395._0_4_ = auVar384._0_4_ * auVar173._0_4_ * auVar400._0_4_;
                  auVar395._4_4_ = auVar384._4_4_ * auVar173._4_4_ * auVar400._4_4_;
                  auVar395._8_4_ = auVar384._8_4_ * auVar173._8_4_ * auVar400._8_4_;
                  auVar395._12_4_ = auVar384._12_4_ * auVar173._12_4_ * auVar400._12_4_;
                  auVar409._8_4_ = 0xb95e8083;
                  auVar409._0_8_ = 0xb95e8083b95e8083;
                  auVar409._12_4_ = 0xb95e8083;
                  auVar400 = vfmadd231ps_fma(auVar395,auVar377,auVar409);
                  auVar383 = vfmsub231ps_fma(auVar400,auVar399,auVar384);
                  auVar400 = vcmpps_avx(auVar148,ZEXT816(0) << 0x20,2);
                  auVar383 = vsubps_avx(auVar383,auVar173);
                  auVar432._8_4_ = 0x42b0c0a5;
                  auVar432._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar432._12_4_ = 0x42b0c0a5;
                  auVar335._8_4_ = 0x3f800000;
                  auVar335._0_8_ = 0x3f8000003f800000;
                  auVar335._12_4_ = 0x3f800000;
                  auVar377 = vfnmadd231ps_fma(auVar383,auVar83,auVar377);
                  auVar174._0_4_ = auVar377._0_4_ + auVar377._0_4_;
                  auVar174._4_4_ = auVar377._4_4_ + auVar377._4_4_;
                  auVar174._8_4_ = auVar377._8_4_ + auVar377._8_4_;
                  auVar174._12_4_ = auVar377._12_4_ + auVar377._12_4_;
                  auVar297._8_4_ = 0x7fffffff;
                  auVar297._0_8_ = 0x7fffffff7fffffff;
                  auVar297._12_4_ = 0x7fffffff;
                  auVar400 = vblendvps_avx(auVar174,auVar297,auVar400);
                  auVar400 = vminps_avx(auVar432,auVar400);
                  auVar383 = vmaxps_avx(auVar450,auVar400);
                  auVar400 = vfmadd213ps_fma(auVar456,auVar383,auVar399);
                  auVar298._0_4_ = (int)auVar400._0_4_;
                  auVar298._4_4_ = (int)auVar400._4_4_;
                  auVar298._8_4_ = (int)auVar400._8_4_;
                  auVar298._12_4_ = (int)auVar400._12_4_;
                  auVar377 = vcvtdq2ps_avx(auVar298);
                  auVar400 = vcmpps_avx(auVar400,auVar377,1);
                  auVar400 = vandps_avx(auVar400,auVar335);
                  auVar400 = vsubps_avx(auVar377,auVar400);
                  auVar377 = vfmsub231ps_fma(auVar383,auVar400,auVar83);
                  auVar84._8_4_ = 0xb95e8083;
                  auVar84._0_8_ = 0xb95e8083b95e8083;
                  auVar84._12_4_ = 0xb95e8083;
                  auVar383 = vfnmsub231ps_fma(auVar377,auVar400,auVar84);
                  auVar299._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar299._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar299._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar299._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar377 = vfmadd213ps_fma(auVar431,auVar383,auVar462);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar239);
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar334);
                  auVar85._8_4_ = 0x3e2aaaaa;
                  auVar85._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar85._12_4_ = 0x3e2aaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar383,auVar85);
                  auVar312 = ZEXT1664(auVar399);
                  auVar399 = vfmadd213ps_fma(auVar377,auVar383,auVar399);
                  auVar399 = vfmadd213ps_fma(auVar399,auVar299,auVar383);
                  auVar113._0_4_ = auVar399._0_4_ + 1.0;
                  auVar113._4_4_ = auVar399._4_4_ + 1.0;
                  auVar113._8_4_ = auVar399._8_4_ + 1.0;
                  auVar113._12_4_ = auVar399._12_4_ + 1.0;
                  auVar175._0_4_ = (int)auVar400._0_4_;
                  auVar175._4_4_ = (int)auVar400._4_4_;
                  auVar175._8_4_ = (int)auVar400._8_4_;
                  auVar175._12_4_ = (int)auVar400._12_4_;
                  auVar400 = vpslld_avx(auVar175,0x17);
                  auVar400 = vpaddd_avx(auVar400,auVar335);
                  auVar95 = ZEXT1664(auVar335);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar113,auVar335);
                  auVar114._8_4_ = 0x40000000;
                  auVar114._0_8_ = 0x4000000040000000;
                  auVar114._12_4_ = 0x40000000;
                  auVar400 = vdivps_avx(auVar114,auVar400);
                  auVar119 = vfmsub213ps_fma(auVar400,auVar232,auVar232);
                  break;
                case 6:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar118._4_4_ = uVar79;
                  auVar118._0_4_ = uVar79;
                  auVar118._8_4_ = uVar79;
                  auVar118._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar184._4_4_ = uVar79;
                  auVar184._0_4_ = uVar79;
                  auVar184._8_4_ = uVar79;
                  auVar184._12_4_ = uVar79;
                  auVar232 = vfmadd231ps_fma(auVar184,auVar232,auVar118);
                  auVar232 = vmaxps_avx(auVar232,_DAT_00536030);
                  auVar232 = vminps_avx(auVar232,auVar400);
                  auVar119._0_4_ = auVar369._0_4_ * auVar232._0_4_;
                  auVar119._4_4_ = auVar369._4_4_ * auVar232._4_4_;
                  auVar119._8_4_ = auVar369._8_4_ * auVar232._8_4_;
                  auVar119._12_4_ = auVar369._12_4_ * auVar232._12_4_;
                }
              }
              *local_1e8 = auVar119;
              local_1e8 = local_1e8 + 1;
              iVar55 = iVar55 + 1;
            }
            uVar41 = (ulong)(uVar37 + 1);
          }
        }
      }
      if ((iVar70 == 1) && (uVar50 == 4)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).stride_w;
        iVar47 = (this->super_Deconvolution).stride_h;
        iVar49 = (this->super_Deconvolution).activation_type;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar71 = 0;
        if (0 < (int)uVar7) {
          uVar71 = (ulong)uVar7;
        }
        uVar65 = 0;
        uVar36 = local_198.c;
        if (local_198.c < 1) {
          uVar36 = 0;
        }
        auVar146 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar454 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar460 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar322._8_4_ = 0x3f000000;
        auVar322._0_8_ = 0x3f0000003f000000;
        auVar322._12_4_ = 0x3f000000;
        auVar369 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar465 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar466 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar312 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar147 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        auVar95 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
        auVar145 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
        for (; uVar65 != uVar36; uVar65 = uVar65 + 1) {
          local_1e8 = (undefined1 (*) [16])
                      (local_198.cstep * uVar65 * local_198.elemsize + (long)local_198.data);
          iVar68 = bottom_blob->w;
          iVar6 = bottom_blob->h;
          uVar41 = 0;
          uVar67 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar67 = uVar41;
          }
          uVar46 = local_198.w;
          if (local_198.w < 1) {
            uVar46 = 0;
          }
          uVar69 = local_198.h;
          if (local_198.h < 1) {
            uVar69 = 0;
          }
          while (uVar37 = (uint)uVar41, uVar37 != uVar69) {
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar35 = 0; uVar35 != uVar46; uVar35 = uVar35 + 1) {
              if (pvVar11 == (void *)0x0) {
                auVar232 = ZEXT816(0) << 0x40;
              }
              else {
                auVar232 = *(undefined1 (*) [16])((long)pvVar11 + uVar65 * 0x10);
              }
              auVar485 = ZEXT1664(auVar232);
              pvVar75 = (void *)((this->weight_data_tm).cstep * uVar65 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar41 = 0; uVar41 != uVar67; uVar41 = uVar41 + 1) {
                pvVar62 = pvVar75;
                for (uVar72 = 0; uVar72 != uVar71; uVar72 = uVar72 + 1) {
                  iVar34 = (((int)uVar72 - uVar7) + 1) * iVar48 + uVar37;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                     (iVar51 < iVar6)) {
                    iVar34 = iVar55;
                    for (lVar43 = 0; uVar54 * 0x10 != lVar43; lVar43 = lVar43 + 0x10) {
                      if (((-1 < iVar34) && (iVar38 = iVar34 / iVar33, iVar34 % iVar33 == 0)) &&
                         (iVar38 < iVar68)) {
                        uVar79 = *(undefined4 *)
                                  ((long)bottom_blob->data +
                                  (long)iVar38 * 4 +
                                  (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize +
                                  bottom_blob->cstep * bottom_blob->elemsize * uVar41);
                        auVar120._4_4_ = uVar79;
                        auVar120._0_4_ = uVar79;
                        auVar120._8_4_ = uVar79;
                        auVar120._12_4_ = uVar79;
                        auVar232 = vfmadd231ps_fma(auVar485._0_16_,auVar120,
                                                   *(undefined1 (*) [16])((long)pvVar62 + lVar43));
                        auVar485 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  pvVar62 = (void *)((long)pvVar62 + (long)(int)uVar39 * 0x10);
                }
                pvVar75 = (void *)((long)pvVar75 + (long)(int)(uVar39 * uVar7 * 4) * 4);
              }
              auVar232 = auVar485._0_16_;
              auVar129 = auVar232;
              if (iVar49 - 1U < 6) {
                auVar129 = vmaxps_avx(auVar232,_DAT_00536030);
                auVar377 = auVar369._0_16_;
                auVar400 = auVar95._0_16_;
                auVar383 = auVar465._0_16_;
                auVar399 = auVar312._0_16_;
                auVar313 = auVar147._0_16_;
                auVar234 = auVar466._0_16_;
                auVar148 = auVar460._0_16_;
                auVar233 = auVar454._0_16_;
                auVar96 = auVar146._0_16_;
                switch(iVar49) {
                case 2:
                  auVar232 = vminps_avx(auVar232,_DAT_00536030);
                  uVar79 = *(this->super_Deconvolution).activation_params.data;
                  auVar388._4_4_ = uVar79;
                  auVar388._0_4_ = uVar79;
                  auVar388._8_4_ = uVar79;
                  auVar388._12_4_ = uVar79;
                  auVar129 = vfmadd231ps_fma(auVar129,auVar232,auVar388);
                  break;
                case 3:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar125._4_4_ = uVar79;
                  auVar125._0_4_ = uVar79;
                  auVar125._8_4_ = uVar79;
                  auVar125._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar390._4_4_ = uVar79;
                  auVar390._0_4_ = uVar79;
                  auVar390._8_4_ = uVar79;
                  auVar390._12_4_ = uVar79;
                  auVar232 = vmaxps_avx(auVar232,auVar125);
                  auVar129 = vminps_avx(auVar390,auVar232);
                  break;
                case 4:
                  auVar126._0_8_ = auVar485._0_8_ ^ 0x8000000080000000;
                  auVar126._8_4_ = -auVar485._8_4_;
                  auVar126._12_4_ = -auVar485._12_4_;
                  auVar232 = vminps_avx(auVar96,auVar126);
                  auVar233 = vmaxps_avx(auVar233,auVar232);
                  auVar232 = vfmadd213ps_fma(auVar148,auVar233,auVar322);
                  auVar471._0_4_ = (int)auVar232._0_4_;
                  auVar471._4_4_ = (int)auVar232._4_4_;
                  auVar471._8_4_ = (int)auVar232._8_4_;
                  auVar471._12_4_ = (int)auVar232._12_4_;
                  auVar96 = vcvtdq2ps_avx(auVar471);
                  auVar232 = vcmpps_avx(auVar232,auVar96,1);
                  auVar232 = vandps_avx(auVar232,auVar377);
                  auVar232 = vsubps_avx(auVar96,auVar232);
                  auVar383 = vfmsub231ps_fma(auVar233,auVar232,auVar383);
                  auVar191._8_4_ = 0x395e8083;
                  auVar191._0_8_ = 0x395e8083395e8083;
                  auVar191._12_4_ = 0x395e8083;
                  auVar383 = vfmsub231ps_fma(auVar383,auVar232,auVar191);
                  auVar472._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar472._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar472._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar472._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar383,auVar234);
                  auVar399 = vfmadd213ps_fma(auVar399,auVar383,auVar313);
                  auVar400 = vfmadd213ps_fma(auVar399,auVar383,auVar400);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar383,auVar145._0_16_);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar383,auVar322);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar472,auVar383);
                  auVar127._0_4_ = auVar400._0_4_ + auVar369._0_4_;
                  auVar127._4_4_ = auVar400._4_4_ + auVar369._4_4_;
                  auVar127._8_4_ = auVar400._8_4_ + auVar369._8_4_;
                  auVar127._12_4_ = auVar400._12_4_ + auVar369._12_4_;
                  auVar391._0_4_ = (int)auVar232._0_4_;
                  auVar391._4_4_ = (int)auVar232._4_4_;
                  auVar391._8_4_ = (int)auVar232._8_4_;
                  auVar391._12_4_ = (int)auVar232._12_4_;
                  auVar232 = vpslld_avx(auVar391,0x17);
                  auVar232 = vpaddd_avx(auVar232,auVar377);
                  auVar232 = vfmadd213ps_fma(auVar232,auVar127,auVar377);
                  auVar129 = vdivps_avx(auVar377,auVar232);
                  break;
                case 5:
                  auVar122 = vminps_avx(auVar232,auVar96);
                  auVar97 = vmaxps_avx(auVar233,auVar122);
                  auVar122 = vfmadd213ps_fma(auVar148,auVar97,auVar322);
                  auVar411._0_4_ = (int)auVar122._0_4_;
                  auVar411._4_4_ = (int)auVar122._4_4_;
                  auVar411._8_4_ = (int)auVar122._8_4_;
                  auVar411._12_4_ = (int)auVar122._12_4_;
                  auVar425 = vcvtdq2ps_avx(auVar411);
                  auVar122 = vcmpps_avx(auVar122,auVar425,1);
                  auVar122 = vandps_avx(auVar122,auVar377);
                  auVar122 = vsubps_avx(auVar425,auVar122);
                  auVar425 = vfmsub231ps_fma(auVar97,auVar122,auVar383);
                  auVar185._8_4_ = 0xb95e8083;
                  auVar185._0_8_ = 0xb95e8083b95e8083;
                  auVar185._12_4_ = 0xb95e8083;
                  auVar97 = vfnmsub231ps_fma(auVar425,auVar122,auVar185);
                  auVar412._0_4_ = auVar97._0_4_ * auVar97._0_4_;
                  auVar412._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                  auVar412._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                  auVar412._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                  auVar425 = vfmadd213ps_fma(auVar399,auVar97,auVar234);
                  auVar425 = vfmadd213ps_fma(auVar425,auVar97,auVar313);
                  auVar425 = vfmadd213ps_fma(auVar425,auVar97,auVar400);
                  auVar425 = vfmadd213ps_fma(auVar425,auVar97,auVar145._0_16_);
                  auVar425 = vfmadd213ps_fma(auVar425,auVar97,auVar322);
                  auVar425 = vfmadd213ps_fma(auVar425,auVar412,auVar97);
                  auVar186._0_4_ = auVar425._0_4_ + auVar369._0_4_;
                  auVar186._4_4_ = auVar425._4_4_ + auVar369._4_4_;
                  auVar186._8_4_ = auVar425._8_4_ + auVar369._8_4_;
                  auVar186._12_4_ = auVar425._12_4_ + auVar369._12_4_;
                  auVar121._0_4_ = (int)auVar122._0_4_;
                  auVar121._4_4_ = (int)auVar122._4_4_;
                  auVar121._8_4_ = (int)auVar122._8_4_;
                  auVar121._12_4_ = (int)auVar122._12_4_;
                  auVar122 = vpslld_avx(auVar121,0x17);
                  auVar122 = vpaddd_avx(auVar122,auVar377);
                  auVar235 = vfmadd213ps_fma(auVar122,auVar186,auVar377);
                  auVar187._8_4_ = 0x800000;
                  auVar187._0_8_ = 0x80000000800000;
                  auVar187._12_4_ = 0x800000;
                  auVar377 = vmaxps_avx(auVar235,auVar187);
                  auVar122 = vpsrld_avx(auVar377,0x17);
                  auVar300._8_4_ = 0xffffff82;
                  auVar300._0_8_ = 0xffffff82ffffff82;
                  auVar300._12_4_ = 0xffffff82;
                  auVar122 = vpaddd_avx(auVar122,auVar300);
                  auVar301._8_4_ = 0x807fffff;
                  auVar301._0_8_ = 0x807fffff807fffff;
                  auVar301._12_4_ = 0x807fffff;
                  auVar377 = vandps_avx(auVar377,auVar301);
                  auVar97 = vorps_avx(auVar377,auVar322);
                  auVar425 = vcvtdq2ps_avx(auVar122);
                  auVar302._8_4_ = 0x3f3504f3;
                  auVar302._0_8_ = 0x3f3504f33f3504f3;
                  auVar302._12_4_ = 0x3f3504f3;
                  auVar122 = vcmpps_avx(auVar97,auVar302,1);
                  auVar377 = vandps_avx(auVar122,auVar97);
                  auVar188._0_4_ = auVar97._0_4_ + -1.0 + auVar377._0_4_;
                  auVar188._4_4_ = auVar97._4_4_ + -1.0 + auVar377._4_4_;
                  auVar188._8_4_ = auVar97._8_4_ + -1.0 + auVar377._8_4_;
                  auVar188._12_4_ = auVar97._12_4_ + -1.0 + auVar377._12_4_;
                  auVar303._8_4_ = 0x3f800000;
                  auVar303._0_8_ = 0x3f8000003f800000;
                  auVar303._12_4_ = 0x3f800000;
                  auVar377 = vandps_avx(auVar122,auVar303);
                  auVar122 = vsubps_avx(auVar425,auVar377);
                  auVar389._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                  auVar389._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                  auVar389._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                  auVar389._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                  auVar413._8_4_ = 0x3d9021bb;
                  auVar413._0_8_ = 0x3d9021bb3d9021bb;
                  auVar413._12_4_ = 0x3d9021bb;
                  auVar336._8_4_ = 0xbdebd1b8;
                  auVar336._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar336._12_4_ = 0xbdebd1b8;
                  auVar377 = vfmadd213ps_fma(auVar413,auVar188,auVar336);
                  auVar337._8_4_ = 0x3def251a;
                  auVar337._0_8_ = 0x3def251a3def251a;
                  auVar337._12_4_ = 0x3def251a;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar337);
                  auVar338._8_4_ = 0xbdfe5d4f;
                  auVar338._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar338._12_4_ = 0xbdfe5d4f;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar338);
                  auVar339._8_4_ = 0x3e11e9bf;
                  auVar339._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar339._12_4_ = 0x3e11e9bf;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar339);
                  auVar340._8_4_ = 0xbe2aae50;
                  auVar340._0_8_ = 0xbe2aae50be2aae50;
                  auVar340._12_4_ = 0xbe2aae50;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar340);
                  auVar341._8_4_ = 0x3e4cceac;
                  auVar341._0_8_ = 0x3e4cceac3e4cceac;
                  auVar341._12_4_ = 0x3e4cceac;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar341);
                  auVar342._8_4_ = 0xbe7ffffc;
                  auVar342._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar342._12_4_ = 0xbe7ffffc;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar342);
                  auVar343._8_4_ = 0x3eaaaaaa;
                  auVar343._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar343._12_4_ = 0x3eaaaaaa;
                  auVar377 = vfmadd213ps_fma(auVar377,auVar188,auVar343);
                  auVar396._0_4_ = auVar389._0_4_ * auVar188._0_4_ * auVar377._0_4_;
                  auVar396._4_4_ = auVar389._4_4_ * auVar188._4_4_ * auVar377._4_4_;
                  auVar396._8_4_ = auVar389._8_4_ * auVar188._8_4_ * auVar377._8_4_;
                  auVar396._12_4_ = auVar389._12_4_ * auVar188._12_4_ * auVar377._12_4_;
                  auVar414._8_4_ = 0xb95e8083;
                  auVar414._0_8_ = 0xb95e8083b95e8083;
                  auVar414._12_4_ = 0xb95e8083;
                  auVar377 = vfmadd231ps_fma(auVar396,auVar122,auVar414);
                  auVar425 = vfmsub231ps_fma(auVar377,auVar322,auVar389);
                  auVar377 = vcmpps_avx(auVar235,_DAT_00536030,2);
                  auVar425 = vsubps_avx(auVar425,auVar188);
                  auVar146 = ZEXT1664(auVar96);
                  auVar454 = ZEXT1664(auVar233);
                  auVar460 = ZEXT1664(auVar148);
                  auVar466 = ZEXT1664(auVar234);
                  auVar147 = ZEXT1664(auVar313);
                  auVar312 = ZEXT1664(auVar399);
                  auVar465 = ZEXT1664(auVar383);
                  auVar95 = ZEXT1664(auVar400);
                  auVar122 = vfnmadd231ps_fma(auVar425,auVar383,auVar122);
                  auVar189._0_4_ = auVar122._0_4_ + auVar122._0_4_;
                  auVar189._4_4_ = auVar122._4_4_ + auVar122._4_4_;
                  auVar189._8_4_ = auVar122._8_4_ + auVar122._8_4_;
                  auVar189._12_4_ = auVar122._12_4_ + auVar122._12_4_;
                  auVar304._8_4_ = 0x7fffffff;
                  auVar304._0_8_ = 0x7fffffff7fffffff;
                  auVar304._12_4_ = 0x7fffffff;
                  auVar377 = vblendvps_avx(auVar189,auVar304,auVar377);
                  auVar377 = vminps_avx(auVar96,auVar377);
                  auVar233 = vmaxps_avx(auVar233,auVar377);
                  auVar377 = vfmadd213ps_fma(auVar148,auVar233,auVar322);
                  auVar305._0_4_ = (int)auVar377._0_4_;
                  auVar305._4_4_ = (int)auVar377._4_4_;
                  auVar305._8_4_ = (int)auVar377._8_4_;
                  auVar305._12_4_ = (int)auVar377._12_4_;
                  auVar96 = vcvtdq2ps_avx(auVar305);
                  auVar377 = vcmpps_avx(auVar377,auVar96,1);
                  auVar344._8_4_ = 0x3f800000;
                  auVar344._0_8_ = 0x3f8000003f800000;
                  auVar344._12_4_ = 0x3f800000;
                  auVar377 = vandps_avx(auVar377,auVar344);
                  auVar345._8_4_ = 0x3e2aaaaa;
                  auVar345._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar345._12_4_ = 0x3e2aaaaa;
                  auVar145 = ZEXT1664(auVar345);
                  auVar377 = vsubps_avx(auVar96,auVar377);
                  auVar383 = vfmsub231ps_fma(auVar233,auVar377,auVar383);
                  auVar306._8_4_ = 0xb95e8083;
                  auVar306._0_8_ = 0xb95e8083b95e8083;
                  auVar306._12_4_ = 0xb95e8083;
                  auVar383 = vfnmsub231ps_fma(auVar383,auVar377,auVar306);
                  auVar307._0_4_ = auVar383._0_4_ * auVar383._0_4_;
                  auVar307._4_4_ = auVar383._4_4_ * auVar383._4_4_;
                  auVar307._8_4_ = auVar383._8_4_ * auVar383._8_4_;
                  auVar307._12_4_ = auVar383._12_4_ * auVar383._12_4_;
                  auVar399 = vfmadd213ps_fma(auVar399,auVar383,auVar234);
                  auVar399 = vfmadd213ps_fma(auVar399,auVar383,auVar313);
                  auVar400 = vfmadd213ps_fma(auVar399,auVar383,auVar400);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar383,auVar345);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar383,auVar322);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar307,auVar383);
                  auVar308._8_4_ = 0x3f800000;
                  auVar308._0_8_ = 0x3f8000003f800000;
                  auVar308._12_4_ = 0x3f800000;
                  auVar369 = ZEXT1664(auVar308);
                  auVar123._0_4_ = auVar400._0_4_ + 1.0;
                  auVar123._4_4_ = auVar400._4_4_ + 1.0;
                  auVar123._8_4_ = auVar400._8_4_ + 1.0;
                  auVar123._12_4_ = auVar400._12_4_ + 1.0;
                  auVar190._0_4_ = (int)auVar377._0_4_;
                  auVar190._4_4_ = (int)auVar377._4_4_;
                  auVar190._8_4_ = (int)auVar377._8_4_;
                  auVar190._12_4_ = (int)auVar377._12_4_;
                  auVar400 = vpslld_avx(auVar190,0x17);
                  auVar400 = vpaddd_avx(auVar400,auVar308);
                  auVar400 = vfmadd213ps_fma(auVar400,auVar123,auVar308);
                  auVar124._8_4_ = 0x40000000;
                  auVar124._0_8_ = 0x4000000040000000;
                  auVar124._12_4_ = 0x40000000;
                  auVar400 = vdivps_avx(auVar124,auVar400);
                  auVar129 = vfmsub213ps_fma(auVar400,auVar232,auVar232);
                  break;
                case 6:
                  puVar9 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar79 = *puVar9;
                  auVar128._4_4_ = uVar79;
                  auVar128._0_4_ = uVar79;
                  auVar128._8_4_ = uVar79;
                  auVar128._12_4_ = uVar79;
                  uVar79 = puVar9[1];
                  auVar192._4_4_ = uVar79;
                  auVar192._0_4_ = uVar79;
                  auVar192._8_4_ = uVar79;
                  auVar192._12_4_ = uVar79;
                  auVar232 = vfmadd231ps_fma(auVar192,auVar232,auVar128);
                  auVar232 = vmaxps_avx(auVar232,_DAT_00536030);
                  auVar232 = vminps_avx(auVar232,auVar377);
                  auVar129._0_4_ = auVar485._0_4_ * auVar232._0_4_;
                  auVar129._4_4_ = auVar485._4_4_ * auVar232._4_4_;
                  auVar129._8_4_ = auVar485._8_4_ * auVar232._8_4_;
                  auVar129._12_4_ = auVar485._12_4_ * auVar232._12_4_;
                }
              }
              *local_1e8 = auVar129;
              local_1e8 = local_1e8 + 1;
              iVar55 = iVar55 + 1;
            }
            uVar41 = (ulong)(uVar37 + 1);
          }
        }
      }
      if ((iVar70 == 4) && (uVar50 == 1)) {
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar7 = (this->super_Deconvolution).kernel_h;
        iVar64 = (this->super_Deconvolution).dilation_w;
        iVar48 = (this->super_Deconvolution).dilation_h;
        iVar33 = (this->super_Deconvolution).activation_type;
        local_120 = local_198.elemsize * local_198.cstep;
        uVar71 = 0;
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar65 = 0;
        if (0 < (int)uVar7) {
          uVar65 = (ulong)uVar7;
        }
        uVar67 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar67 = uVar71;
        }
        uVar36 = local_198.w;
        if (local_198.w < 1) {
          uVar36 = 0;
        }
        uVar46 = local_198.h;
        if (local_198.h < 1) {
          uVar46 = 0;
        }
        local_138 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          local_138 = uVar71;
        }
        iVar47 = (this->super_Deconvolution).stride_w;
        iVar49 = (this->super_Deconvolution).stride_h;
        pvVar11 = (this->super_Deconvolution).bias_data.data;
        local_128 = local_198.data;
        iVar68 = bottom_blob->w;
        iVar6 = bottom_blob->h;
        for (; uVar71 != local_138; uVar71 = uVar71 + 1) {
          local_240 = (undefined1 (*) [32])(local_120 * uVar71 + (long)local_128);
          for (uVar69 = 0; uVar69 != uVar46; uVar69 = uVar69 + 1) {
            pfVar57 = (float *)(this->super_Deconvolution).activation_params.data;
            sVar12 = (this->weight_data_tm).cstep;
            sVar10 = (this->weight_data_tm).elemsize;
            pvVar75 = (this->weight_data_tm).data;
            iVar55 = (1 - uVar39) * iVar64;
            for (uVar37 = 0; uVar37 != uVar36; uVar37 = uVar37 + 1) {
              if (pvVar11 == (void *)0x0) {
                fVar78 = 0.0;
              }
              else {
                fVar78 = *(float *)((long)pvVar11 + uVar71 * 4);
              }
              auVar95 = ZEXT1664((undefined1  [16])0x0);
              pvVar62 = (void *)(sVar12 * uVar71 * sVar10 + (long)pvVar75);
              for (uVar41 = 0; uVar41 != uVar67; uVar41 = uVar41 + 1) {
                pvVar58 = pvVar62;
                for (uVar72 = 0; uVar72 != uVar65; uVar72 = uVar72 + 1) {
                  iVar34 = (((int)uVar72 - uVar7) + 1) * iVar48 + uVar69;
                  if (((-1 < iVar34) && (iVar51 = iVar34 / iVar49, iVar34 % iVar49 == 0)) &&
                     (iVar51 < iVar6)) {
                    iVar34 = iVar55;
                    for (lVar43 = 0; uVar54 * 0x10 != lVar43; lVar43 = lVar43 + 0x10) {
                      if (((-1 < iVar34) && (iVar38 = iVar34 / iVar47, iVar34 % iVar47 == 0)) &&
                         (iVar38 < iVar68)) {
                        auVar232 = vfmadd231ps_fma(auVar95._0_16_,
                                                   *(undefined1 (*) [16])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar38 << 2) * 4 +
                                                    (long)iVar51 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar41),*(undefined1 (*) [16])
                                                             ((long)pvVar58 + lVar43));
                        auVar95 = ZEXT1664(auVar232);
                      }
                      iVar34 = iVar34 + iVar64;
                    }
                  }
                  pvVar58 = (void *)((long)pvVar58 + (long)(int)uVar39 * 0x10);
                }
                pvVar62 = (void *)((long)pvVar62 + (long)(int)(uVar39 * uVar7 * 4) * 4);
              }
              auVar232 = vshufpd_avx(auVar95._0_16_,auVar95._0_16_,1);
              auVar130._0_4_ = auVar232._0_4_ + auVar95._0_4_;
              auVar130._4_4_ = auVar232._4_4_ + auVar95._4_4_;
              auVar130._8_4_ = auVar232._8_4_ + auVar95._8_4_;
              auVar130._12_4_ = auVar232._12_4_ + auVar95._12_4_;
              auVar232 = vmovshdup_avx(auVar130);
              fVar78 = auVar232._0_4_ + fVar78 + auVar130._0_4_;
              auVar232 = ZEXT416((uint)fVar78);
              fVar77 = fVar78;
              if (iVar33 - 1U < 6) {
                switch(iVar33) {
                case 1:
                  auVar232 = vmaxss_avx(ZEXT416((uint)fVar78),ZEXT416(0));
                  fVar77 = auVar232._0_4_;
                  break;
                case 2:
                  auVar86._0_12_ = ZEXT812(0);
                  auVar86._12_4_ = 0;
                  auVar232 = vcmpss_avx(auVar86,ZEXT416((uint)fVar78),1);
                  auVar194._8_4_ = 0x3f800000;
                  auVar194._0_8_ = 0x3f8000003f800000;
                  auVar194._12_4_ = 0x3f800000;
                  auVar232 = vblendvps_avx(ZEXT416((uint)*pfVar57),auVar194,auVar232);
                  fVar77 = auVar232._0_4_ * fVar78;
                  break;
                case 3:
                  auVar232 = vmaxss_avx(auVar232,ZEXT416((uint)*pfVar57));
                  fVar77 = auVar232._0_4_;
                  if (pfVar57[1] < auVar232._0_4_) {
                    fVar77 = pfVar57[1];
                  }
                  break;
                case 4:
                  auVar232 = vminss_avx(auVar232,ZEXT416(0x42b0c0a5));
                  auVar131._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
                  auVar131._8_4_ = auVar232._8_4_ ^ 0x80000000;
                  auVar131._12_4_ = auVar232._12_4_ ^ 0x80000000;
                  auVar232 = vcmpss_avx(auVar232,ZEXT416(0xc2b0c0a5),1);
                  auVar193._8_4_ = 0x42b0c0a5;
                  auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar193._12_4_ = 0x42b0c0a5;
                  auVar232 = vblendvps_avx(auVar131,auVar193,auVar232);
                  fVar78 = expf(auVar232._0_4_);
                  fVar77 = 1.0 / (fVar78 + 1.0);
                  break;
                case 5:
                  fVar77 = expf(fVar78);
                  fVar77 = logf(fVar77 + 1.0);
                  fVar77 = tanhf(fVar77);
                  fVar77 = fVar77 * fVar78;
                  break;
                case 6:
                  fVar1 = *pfVar57;
                  fVar231 = -pfVar57[1] / fVar1;
                  fVar77 = 0.0;
                  if ((fVar231 <= fVar78) && (fVar77 = fVar78, fVar78 <= fVar231 + 1.0 / fVar1)) {
                    auVar232 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar232,
                                               ZEXT416((uint)pfVar57[1]));
                    fVar77 = auVar232._0_4_ * fVar78;
                  }
                }
              }
              *(float *)local_240 = fVar77;
              local_240 = (undefined1 (*) [32])((long)local_240 + 4);
              iVar55 = iVar55 + 1;
            }
          }
        }
      }
      pvVar11 = local_198.data;
      if ((iVar70 == 1) && (uVar50 == 1)) {
        uVar39 = (this->super_Deconvolution).num_output;
        local_138 = local_198.cstep * local_198.elemsize;
        lVar43 = (long)local_198.w;
        uVar54 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar54 = 0;
        }
        uVar71 = 0;
        if (0 < local_198.w) {
          uVar71 = (ulong)(uint)local_198.w;
        }
        uVar50 = local_198.h;
        if (local_198.h < 1) {
          uVar50 = 0;
        }
        iVar64 = bottom_blob->w;
        uVar65 = (ulong)uVar39;
        if ((int)uVar39 < 1) {
          uVar65 = 0;
        }
        iVar48 = bottom_blob->h;
        local_150 = -local_150;
        local_148 = (void *)((long)local_148 << 2);
        for (uVar67 = 0; uVar67 != uVar65; uVar67 = uVar67 + 1) {
          local_1f0 = (void *)(local_138 * uVar67 + (long)pvVar11);
          for (uVar39 = 0; uVar39 != uVar50; uVar39 = uVar39 + 1) {
            iVar33 = (this->super_Deconvolution).bias_term;
            iVar47 = (this->super_Deconvolution).activation_type;
            pvVar75 = (this->super_Deconvolution).bias_data.data;
            iVar49 = uVar39 - local_14c;
            sVar12 = (this->weight_data_tm).cstep;
            sVar10 = (this->weight_data_tm).elemsize;
            pvVar62 = (this->weight_data_tm).data;
            pfVar57 = (float *)(this->super_Deconvolution).activation_params.data;
            iVar70 = local_150;
            for (uVar41 = 0; uVar41 != uVar71; uVar41 = uVar41 + 1) {
              if (iVar33 == 0) {
                auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar95 = ZEXT464(*(uint *)((long)pvVar75 + uVar67 * 4));
              }
              iVar68 = (this->super_Deconvolution).stride_h;
              uVar7 = (this->super_Deconvolution).kernel_w;
              uVar36 = (this->super_Deconvolution).kernel_h;
              uVar72 = 0;
              if (0 < (int)uVar7) {
                uVar72 = (ulong)uVar7;
              }
              if ((int)uVar36 < 1) {
                uVar36 = 0;
              }
              iVar6 = (this->super_Deconvolution).stride_w;
              pvVar58 = (void *)(sVar12 * uVar67 * sVar10 + (long)pvVar62);
              for (uVar73 = 0; uVar73 != uVar54; uVar73 = uVar73 + 1) {
                pvVar66 = pvVar58;
                for (uVar52 = 0; uVar52 != uVar36; uVar52 = uVar52 + 1) {
                  iVar55 = (this->super_Deconvolution).dilation_h * (int)uVar52 + iVar49;
                  if (((-1 < iVar55) && (iVar34 = iVar55 / iVar68, iVar55 % iVar68 == 0)) &&
                     (iVar34 < iVar48)) {
                    iVar55 = iVar70;
                    for (uVar74 = 0; uVar72 != uVar74; uVar74 = uVar74 + 1) {
                      if (((-1 < iVar55) && (iVar51 = iVar55 / iVar6, iVar55 % iVar6 == 0)) &&
                         (iVar51 < iVar64)) {
                        auVar232 = vfmadd231ss_fma(auVar95._0_16_,
                                                   ZEXT416(*(uint *)((long)pvVar66 + uVar74 * 4)),
                                                   ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                    (long)iVar51 * 4 +
                                                                    (long)iVar34 *
                                                                    (long)bottom_blob->w *
                                                                    bottom_blob->elemsize +
                                                                    bottom_blob->cstep *
                                                                    bottom_blob->elemsize * uVar73))
                                                  );
                        auVar95 = ZEXT1664(auVar232);
                      }
                      iVar55 = iVar55 + (this->super_Deconvolution).dilation_w;
                    }
                  }
                  pvVar66 = (void *)((long)pvVar66 + (long)(int)uVar7 * 4);
                }
                pvVar58 = (void *)((long)pvVar58 + (long)local_148);
              }
              auVar232 = auVar95._0_16_;
              fVar77 = auVar95._0_4_;
              fVar78 = fVar77;
              switch(iVar47) {
              case 1:
                auVar232 = vmaxss_avx(auVar232,ZEXT416(0));
                fVar78 = auVar232._0_4_;
                break;
              case 2:
                auVar232 = vcmpss_avx(ZEXT816(0) << 0x40,auVar232,1);
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar232 = vblendvps_avx(ZEXT416((uint)*pfVar57),auVar196,auVar232);
                fVar78 = auVar232._0_4_ * fVar77;
                break;
              case 3:
                auVar232 = vmaxss_avx(auVar232,ZEXT416((uint)*pfVar57));
                fVar78 = auVar232._0_4_;
                if (pfVar57[1] < auVar232._0_4_) {
                  fVar78 = pfVar57[1];
                }
                break;
              case 4:
                auVar232 = vminss_avx(auVar232,ZEXT416(0x42b0c0a5));
                auVar132._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
                auVar132._8_4_ = auVar232._8_4_ ^ 0x80000000;
                auVar132._12_4_ = auVar232._12_4_ ^ 0x80000000;
                auVar232 = vcmpss_avx(auVar232,ZEXT416(0xc2b0c0a5),1);
                auVar195._8_4_ = 0x42b0c0a5;
                auVar195._0_8_ = 0x42b0c0a542b0c0a5;
                auVar195._12_4_ = 0x42b0c0a5;
                auVar232 = vblendvps_avx(auVar132,auVar195,auVar232);
                fVar78 = expf(auVar232._0_4_);
                fVar78 = 1.0 / (fVar78 + 1.0);
                break;
              case 5:
                fVar78 = expf(fVar77);
                fVar78 = logf(fVar78 + 1.0);
                fVar78 = tanhf(fVar78);
                fVar78 = fVar78 * fVar77;
                break;
              case 6:
                fVar1 = *pfVar57;
                fVar231 = -pfVar57[1] / fVar1;
                fVar78 = 0.0;
                if ((fVar231 <= fVar77) && (fVar78 = fVar77, fVar77 <= fVar231 + 1.0 / fVar1)) {
                  auVar232 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar232,ZEXT416((uint)pfVar57[1])
                                            );
                  fVar78 = auVar232._0_4_ * fVar77;
                }
              }
              *(float *)((long)local_1f0 + uVar41 * 4) = fVar78;
              iVar70 = iVar70 + 1;
            }
            local_1f0 = (void *)((long)local_1f0 + lVar43 * 4);
          }
        }
      }
    }
    pMVar32 = local_130;
    Deconvolution::cut_padding(&this->super_Deconvolution,&local_198,local_130,local_140);
    if ((pMVar32->data == (void *)0x0) || (iVar33 = 0, (long)pMVar32->c * pMVar32->cstep == 0)) {
      iVar33 = -100;
    }
  }
LAB_002752cc:
  piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        free(local_198.data);
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}